

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::sse2::CurveNiMBIntersector1<4>::
     intersect_t<embree::sse2::RibbonCurve1Intersector1<embree::BezierCurveT,4>,embree::sse2::Intersect1EpilogMU<4,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [12];
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  Primitive PVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  Geometry *pGVar24;
  __int_type_conflict _Var25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  undefined1 auVar69 [16];
  undefined6 uVar70;
  undefined1 auVar71 [12];
  unkbyte9 Var72;
  undefined1 auVar73 [13];
  undefined1 auVar74 [12];
  undefined1 auVar75 [13];
  undefined1 auVar76 [12];
  undefined1 auVar77 [13];
  undefined1 auVar78 [12];
  undefined1 auVar79 [12];
  undefined1 auVar80 [12];
  undefined1 auVar81 [13];
  undefined1 auVar82 [12];
  undefined1 auVar83 [13];
  undefined1 auVar84 [12];
  undefined1 auVar85 [12];
  undefined1 auVar86 [12];
  undefined1 auVar87 [12];
  undefined1 auVar88 [12];
  undefined1 auVar89 [12];
  undefined1 auVar90 [12];
  undefined1 auVar91 [12];
  undefined1 auVar92 [12];
  undefined1 auVar93 [15];
  bool bVar94;
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [13];
  undefined1 auVar102 [15];
  undefined8 uVar103;
  undefined8 uVar104;
  undefined4 uVar105;
  ulong uVar106;
  RTCRayN *pRVar107;
  RTCIntersectArguments *pRVar109;
  ulong uVar110;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  undefined4 uVar111;
  undefined8 unaff_RBP;
  long lVar113;
  long lVar114;
  long lVar115;
  long lVar116;
  uint uVar117;
  uint uVar118;
  uint uVar119;
  uint uVar120;
  uint uVar121;
  short sVar122;
  float fVar123;
  float fVar124;
  float fVar125;
  undefined1 auVar126 [12];
  float fVar181;
  undefined1 auVar131 [16];
  char cVar183;
  undefined1 auVar133 [16];
  undefined1 auVar127 [12];
  undefined1 auVar137 [16];
  undefined1 auVar128 [12];
  undefined1 auVar141 [16];
  float fVar184;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar129 [12];
  undefined1 auVar150 [16];
  undefined1 auVar130 [12];
  undefined1 auVar154 [16];
  undefined1 auVar158 [16];
  undefined1 auVar161 [16];
  undefined1 auVar164 [16];
  undefined1 auVar167 [16];
  float fVar182;
  float fVar185;
  undefined8 uVar186;
  float fVar187;
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar172;
  undefined1 auVar173 [16];
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar174;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar175;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar176;
  float fVar188;
  float fVar189;
  float fVar221;
  float fVar223;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar222;
  float fVar224;
  float fVar225;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  int iVar226;
  int iVar227;
  int iVar228;
  char cVar255;
  undefined1 uVar256;
  int iVar257;
  float fVar260;
  undefined1 auVar232 [16];
  char cVar259;
  undefined1 auVar236 [16];
  undefined1 auVar240 [16];
  undefined1 auVar244 [16];
  float fVar258;
  float fVar261;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar262;
  float fVar275;
  float fVar277;
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar276;
  float fVar278;
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  char cVar294;
  float fVar279;
  float fVar280;
  float fVar295;
  float fVar297;
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  float fVar296;
  float fVar298;
  float fVar299;
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  float fVar300;
  undefined1 uVar309;
  float fVar310;
  undefined1 auVar301 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar316;
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar324;
  undefined1 auVar323 [16];
  float fVar334;
  undefined1 auVar325 [12];
  undefined1 auVar326 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  float fVar336;
  float fVar337;
  float fVar338;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar332;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar333;
  float fVar341;
  float fVar342;
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  float fVar343;
  float fVar344;
  float fVar347;
  float fVar348;
  float fVar349;
  undefined1 auVar345 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar346;
  float fVar350;
  float fVar351;
  float fVar352;
  float fVar353;
  float fVar357;
  float fVar358;
  float fVar361;
  float fVar362;
  float fVar365;
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  float fVar359;
  float fVar360;
  float fVar363;
  float fVar364;
  float fVar366;
  float fVar367;
  undefined1 auVar356 [16];
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar378;
  float fVar381;
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  float fVar379;
  float fVar380;
  float fVar382;
  float fVar383;
  float fVar384;
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  float fVar390;
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  float fVar391;
  float fVar392;
  float fVar397;
  float fVar399;
  float fVar401;
  undefined1 auVar393 [16];
  float fVar398;
  float fVar400;
  float fVar402;
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  float fVar403;
  float fVar404;
  float fVar405;
  float fVar408;
  float fVar409;
  float fVar410;
  float fVar411;
  float fVar412;
  float fVar413;
  undefined1 auVar406 [16];
  float fVar414;
  undefined1 auVar407 [16];
  float fVar415;
  float fVar416;
  undefined1 local_478 [6];
  undefined2 uStack_472;
  float fStack_470;
  undefined4 local_468;
  char local_458;
  char cStack_457;
  undefined1 uStack_456;
  undefined1 uStack_455;
  int local_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_428;
  float fStack_424;
  float fStack_420;
  float fStack_41c;
  undefined8 local_418;
  float fStack_410;
  float fStack_40c;
  undefined1 local_408 [8];
  float fStack_400;
  float fStack_3fc;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3f8;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_3e8;
  undefined8 local_3d8;
  float fStack_3d0;
  float fStack_3cc;
  undefined1 local_3c8 [8];
  int iStack_3c0;
  int iStack_3bc;
  RTCIntersectArguments *local_3b0;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  ulong local_370;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_278;
  float fStack_274;
  float fStack_270;
  undefined8 local_248;
  float local_240;
  float local_23c;
  float local_238;
  undefined4 local_234;
  undefined4 local_230;
  uint local_22c;
  uint local_228;
  RayHit *local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  Primitive *local_170;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_4> bhit;
  ulong uVar108;
  ulong uVar112;
  undefined1 auVar147 [16];
  undefined1 auVar151 [16];
  undefined1 auVar155 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar134 [16];
  undefined1 auVar138 [16];
  undefined1 auVar142 [16];
  undefined1 auVar148 [16];
  undefined1 auVar152 [16];
  undefined1 auVar156 [16];
  undefined1 auVar132 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar143 [16];
  undefined1 auVar149 [16];
  undefined1 auVar153 [16];
  undefined1 auVar157 [16];
  undefined2 uVar177;
  int iVar178;
  int iVar179;
  int iVar180;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar229 [12];
  undefined1 auVar230 [12];
  undefined1 auVar231 [12];
  undefined1 auVar237 [16];
  undefined1 auVar241 [16];
  undefined1 auVar245 [16];
  undefined1 auVar235 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar246 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar335;
  
  uVar104 = mm_lookupmask_ps._8_8_;
  uVar103 = mm_lookupmask_ps._0_8_;
  PVar17 = prim[1];
  uVar106 = (ulong)(byte)PVar17;
  lVar115 = uVar106 * 0x25;
  uVar111 = *(undefined4 *)(prim + uVar106 * 4 + 6);
  uVar18 = *(undefined4 *)(prim + uVar106 * 5 + 6);
  uVar19 = *(undefined4 *)(prim + uVar106 * 6 + 6);
  uVar105 = *(undefined4 *)(prim + uVar106 * 0xf + 6);
  uVar20 = *(undefined4 *)(prim + (ulong)(byte)PVar17 * 0x10 + 6);
  uVar21 = *(undefined4 *)(prim + uVar106 * 0x11 + 6);
  uVar22 = *(undefined4 *)(prim + uVar106 * 0x1a + 6);
  uVar23 = *(undefined4 *)(prim + uVar106 * 0x1b + 6);
  pPVar7 = prim + lVar115 + 6;
  fVar361 = *(float *)(pPVar7 + 0xc);
  fVar188 = ((ray->super_RayK<1>).org.field_0.m128[0] - *(float *)pPVar7) * fVar361;
  fVar221 = ((ray->super_RayK<1>).org.field_0.m128[1] - *(float *)(pPVar7 + 4)) * fVar361;
  fVar223 = ((ray->super_RayK<1>).org.field_0.m128[2] - *(float *)(pPVar7 + 8)) * fVar361;
  fVar350 = fVar361 * (ray->super_RayK<1>).dir.field_0.m128[0];
  fVar357 = fVar361 * (ray->super_RayK<1>).dir.field_0.m128[1];
  fVar361 = fVar361 * (ray->super_RayK<1>).dir.field_0.m128[2];
  uVar256 = (undefined1)((uint)uVar18 >> 0x18);
  uVar177 = CONCAT11(uVar256,uVar256);
  uVar256 = (undefined1)((uint)uVar18 >> 0x10);
  uVar186 = CONCAT35(CONCAT21(uVar177,uVar256),CONCAT14(uVar256,uVar18));
  cVar255 = (char)((uint)uVar18 >> 8);
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar186 >> 0x20),cVar255),cVar255);
  cVar183 = (char)uVar18;
  uVar112 = CONCAT62(uVar70,CONCAT11(cVar183,cVar183));
  auVar234._8_4_ = 0;
  auVar234._0_8_ = uVar112;
  auVar234._12_2_ = uVar177;
  auVar234._14_2_ = uVar177;
  uVar177 = (undefined2)((ulong)uVar186 >> 0x20);
  auVar233._12_4_ = auVar234._12_4_;
  auVar233._8_2_ = 0;
  auVar233._0_8_ = uVar112;
  auVar233._10_2_ = uVar177;
  auVar232._10_6_ = auVar233._10_6_;
  auVar232._8_2_ = uVar177;
  auVar232._0_8_ = uVar112;
  uVar177 = (undefined2)uVar70;
  auVar71._4_8_ = auVar232._8_8_;
  auVar71._2_2_ = uVar177;
  auVar71._0_2_ = uVar177;
  iVar226 = (int)CONCAT11(cVar183,cVar183) >> 8;
  iVar257 = auVar71._0_4_ >> 0x18;
  auVar229._0_8_ = CONCAT44(iVar257,iVar226);
  auVar229._8_4_ = auVar232._8_4_ >> 0x18;
  auVar235._12_4_ = auVar233._12_4_ >> 0x18;
  auVar235._0_12_ = auVar229;
  fVar341 = (float)iVar257;
  cVar259 = cVar255 >> 7;
  auVar29[0xd] = 0;
  auVar29._0_13_ = auVar235._0_13_;
  auVar29[0xe] = cVar259;
  auVar34[0xc] = cVar259;
  auVar34._0_12_ = auVar229;
  auVar34._13_2_ = auVar29._13_2_;
  auVar39[0xb] = 0;
  auVar39._0_11_ = auVar229._0_11_;
  auVar39._12_3_ = auVar34._12_3_;
  auVar44[10] = cVar259;
  auVar44._0_10_ = auVar229._0_10_;
  auVar44._11_4_ = auVar39._11_4_;
  auVar49[9] = 0;
  auVar49._0_9_ = auVar229._0_9_;
  auVar49._10_5_ = auVar44._10_5_;
  auVar54[8] = cVar255;
  auVar54._0_8_ = auVar229._0_8_;
  auVar54._9_6_ = auVar49._9_6_;
  Var72 = CONCAT81(CONCAT71(auVar54._8_7_,(char)((uint)uVar19 >> 0x18)),(short)cVar183 >> 7);
  auVar59._6_9_ = Var72;
  auVar59[5] = (char)((uint)uVar19 >> 0x10);
  auVar59[4] = (undefined1)((short)cVar183 >> 7);
  auVar59._0_4_ = iVar226;
  cVar259 = (char)((uint)uVar19 >> 8);
  auVar73._2_11_ = auVar59._4_11_;
  auVar73[1] = cVar259;
  auVar73[0] = (undefined1)((short)cVar183 >> 7);
  cVar255 = (char)uVar19;
  auVar64._2_13_ = auVar73;
  auVar64._0_2_ = CONCAT11(cVar255,cVar183);
  uVar177 = (undefined2)Var72;
  auVar238._0_12_ = auVar64._0_12_;
  auVar238._12_2_ = uVar177;
  auVar238._14_2_ = uVar177;
  auVar237._12_4_ = auVar238._12_4_;
  auVar237._0_10_ = auVar64._0_10_;
  auVar237._10_2_ = auVar59._4_2_;
  auVar236._10_6_ = auVar237._10_6_;
  auVar236._0_8_ = auVar64._0_8_;
  auVar236._8_2_ = auVar59._4_2_;
  auVar74._4_8_ = auVar236._8_8_;
  auVar74._2_2_ = auVar73._0_2_;
  auVar74._0_2_ = auVar73._0_2_;
  iVar227 = (int)CONCAT11(cVar255,cVar183) >> 8;
  iVar257 = auVar74._0_4_ >> 0x18;
  auVar230._0_8_ = CONCAT44(iVar257,iVar227);
  auVar230._8_4_ = auVar236._8_4_ >> 0x18;
  auVar239._12_4_ = auVar237._12_4_ >> 0x18;
  auVar239._0_12_ = auVar230;
  fVar390 = (float)iVar257;
  cVar183 = cVar259 >> 7;
  auVar30[0xd] = 0;
  auVar30._0_13_ = auVar239._0_13_;
  auVar30[0xe] = cVar183;
  auVar35[0xc] = cVar183;
  auVar35._0_12_ = auVar230;
  auVar35._13_2_ = auVar30._13_2_;
  auVar40[0xb] = 0;
  auVar40._0_11_ = auVar230._0_11_;
  auVar40._12_3_ = auVar35._12_3_;
  auVar45[10] = cVar183;
  auVar45._0_10_ = auVar230._0_10_;
  auVar45._11_4_ = auVar40._11_4_;
  auVar50[9] = 0;
  auVar50._0_9_ = auVar230._0_9_;
  auVar50._10_5_ = auVar45._10_5_;
  auVar55[8] = cVar259;
  auVar55._0_8_ = auVar230._0_8_;
  auVar55._9_6_ = auVar50._9_6_;
  Var72 = CONCAT81(CONCAT71(auVar55._8_7_,(char)((uint)uVar20 >> 0x18)),(short)cVar255 >> 7);
  auVar60._6_9_ = Var72;
  auVar60[5] = (char)((uint)uVar20 >> 0x10);
  auVar60[4] = (undefined1)((short)cVar255 >> 7);
  auVar60._0_4_ = iVar227;
  cVar294 = (char)((uint)uVar20 >> 8);
  auVar75._2_11_ = auVar60._4_11_;
  auVar75[1] = cVar294;
  auVar75[0] = (undefined1)((short)cVar255 >> 7);
  cVar259 = (char)uVar20;
  auVar65._2_13_ = auVar75;
  auVar65._0_2_ = CONCAT11(cVar259,cVar255);
  uVar177 = (undefined2)Var72;
  auVar242._0_12_ = auVar65._0_12_;
  auVar242._12_2_ = uVar177;
  auVar242._14_2_ = uVar177;
  auVar241._12_4_ = auVar242._12_4_;
  auVar241._0_10_ = auVar65._0_10_;
  auVar241._10_2_ = auVar60._4_2_;
  auVar240._10_6_ = auVar241._10_6_;
  auVar240._0_8_ = auVar65._0_8_;
  auVar240._8_2_ = auVar60._4_2_;
  auVar76._4_8_ = auVar240._8_8_;
  auVar76._2_2_ = auVar75._0_2_;
  auVar76._0_2_ = auVar75._0_2_;
  iVar228 = (int)CONCAT11(cVar259,cVar255) >> 8;
  iVar257 = auVar76._0_4_ >> 0x18;
  auVar231._0_8_ = CONCAT44(iVar257,iVar228);
  auVar231._8_4_ = auVar240._8_4_ >> 0x18;
  auVar243._12_4_ = auVar241._12_4_ >> 0x18;
  auVar243._0_12_ = auVar231;
  fVar334 = (float)iVar257;
  cVar183 = cVar294 >> 7;
  auVar31[0xd] = 0;
  auVar31._0_13_ = auVar243._0_13_;
  auVar31[0xe] = cVar183;
  auVar36[0xc] = cVar183;
  auVar36._0_12_ = auVar231;
  auVar36._13_2_ = auVar31._13_2_;
  auVar41[0xb] = 0;
  auVar41._0_11_ = auVar231._0_11_;
  auVar41._12_3_ = auVar36._12_3_;
  auVar46[10] = cVar183;
  auVar46._0_10_ = auVar231._0_10_;
  auVar46._11_4_ = auVar41._11_4_;
  auVar51[9] = 0;
  auVar51._0_9_ = auVar231._0_9_;
  auVar51._10_5_ = auVar46._10_5_;
  auVar56[8] = cVar294;
  auVar56._0_8_ = auVar231._0_8_;
  auVar56._9_6_ = auVar51._9_6_;
  Var72 = CONCAT81(CONCAT71(auVar56._8_7_,(char)((uint)uVar21 >> 0x18)),(short)cVar259 >> 7);
  auVar61._6_9_ = Var72;
  auVar61[5] = (char)((uint)uVar21 >> 0x10);
  auVar61[4] = (undefined1)((short)cVar259 >> 7);
  auVar61._0_4_ = iVar228;
  auVar77._2_11_ = auVar61._4_11_;
  auVar77[1] = (char)((uint)uVar21 >> 8);
  auVar77[0] = (undefined1)((short)cVar259 >> 7);
  sVar122 = CONCAT11((char)uVar21,cVar259);
  auVar66._2_13_ = auVar77;
  auVar66._0_2_ = sVar122;
  uVar177 = (undefined2)Var72;
  auVar246._0_12_ = auVar66._0_12_;
  auVar246._12_2_ = uVar177;
  auVar246._14_2_ = uVar177;
  auVar245._12_4_ = auVar246._12_4_;
  auVar245._0_10_ = auVar66._0_10_;
  auVar245._10_2_ = auVar61._4_2_;
  auVar244._10_6_ = auVar245._10_6_;
  auVar244._0_8_ = auVar66._0_8_;
  auVar244._8_2_ = auVar61._4_2_;
  auVar78._4_8_ = auVar244._8_8_;
  auVar78._2_2_ = auVar77._0_2_;
  auVar78._0_2_ = auVar77._0_2_;
  fVar311 = (float)((int)sVar122 >> 8);
  fVar316 = (float)(auVar78._0_4_ >> 0x18);
  fVar320 = (float)(auVar244._8_4_ >> 0x18);
  uVar18 = *(undefined4 *)(prim + uVar106 * 0x1c + 6);
  fVar123 = ((ray->super_RayK<1>).dir.field_0.m128[3] - *(float *)(prim + lVar115 + 0x16)) *
            *(float *)(prim + lVar115 + 0x1a);
  _local_408 = ZEXT416((uint)fVar123);
  local_458 = (char)uVar111;
  cStack_457 = (char)((uint)uVar111 >> 8);
  uStack_456 = (undefined1)((uint)uVar111 >> 0x10);
  uStack_455 = (undefined1)((uint)uVar111 >> 0x18);
  uVar177 = CONCAT11(uStack_455,(char)((uint)fVar123 >> 0x18));
  uVar186 = CONCAT35(CONCAT21(uVar177,uStack_456),CONCAT14((char)((uint)fVar123 >> 0x10),fVar123));
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar186 >> 0x20),cStack_457),(char)((uint)fVar123 >> 8));
  sVar122 = CONCAT11(local_458,SUB41(fVar123,0));
  uVar112 = CONCAT62(uVar70,sVar122);
  auVar131._8_4_ = 0;
  auVar131._0_8_ = uVar112;
  auVar131._12_2_ = uVar177;
  auVar131._14_2_ = uVar177;
  uVar177 = (undefined2)((ulong)uVar186 >> 0x20);
  auVar264._12_4_ = auVar131._12_4_;
  auVar264._8_2_ = 0;
  auVar264._0_8_ = uVar112;
  auVar264._10_2_ = uVar177;
  auVar190._10_6_ = auVar264._10_6_;
  auVar190._8_2_ = uVar177;
  auVar190._0_8_ = uVar112;
  uVar177 = (undefined2)uVar70;
  auVar79._4_8_ = auVar190._8_8_;
  auVar79._2_2_ = uVar177;
  auVar79._0_2_ = uVar177;
  iVar257 = (int)sVar122 >> 8;
  iVar178 = auVar79._0_4_ >> 0x18;
  auVar126._0_8_ = CONCAT44(iVar178,iVar257);
  auVar126._8_4_ = auVar190._8_4_ >> 0x18;
  auVar132._12_4_ = auVar264._12_4_ >> 0x18;
  auVar132._0_12_ = auVar126;
  fVar324 = (float)iVar178;
  local_468._0_1_ = (char)uVar105;
  local_468._1_1_ = (char)((uint)uVar105 >> 8);
  local_468._2_1_ = (undefined1)((uint)uVar105 >> 0x10);
  local_468._3_1_ = (undefined1)((uint)uVar105 >> 0x18);
  cVar183 = cStack_457 >> 7;
  auVar93[0xd] = 0;
  auVar93._0_13_ = auVar132._0_13_;
  auVar93[0xe] = cVar183;
  auVar95[0xc] = cVar183;
  auVar95._0_12_ = auVar126;
  auVar95._13_2_ = auVar93._13_2_;
  auVar96[0xb] = 0;
  auVar96._0_11_ = auVar126._0_11_;
  auVar96._12_3_ = auVar95._12_3_;
  auVar97[10] = cVar183;
  auVar97._0_10_ = auVar126._0_10_;
  auVar97._11_4_ = auVar96._11_4_;
  auVar98[9] = 0;
  auVar98._0_9_ = auVar126._0_9_;
  auVar98._10_5_ = auVar97._10_5_;
  auVar99[8] = cStack_457;
  auVar99._0_8_ = auVar126._0_8_;
  auVar99._9_6_ = auVar98._9_6_;
  Var72 = CONCAT81(CONCAT71(auVar99._8_7_,local_468._3_1_),(short)local_458 >> 7);
  auVar100._6_9_ = Var72;
  auVar100[5] = local_468._2_1_;
  auVar100[4] = (undefined1)((short)local_458 >> 7);
  auVar100._0_4_ = iVar257;
  auVar101._2_11_ = auVar100._4_11_;
  auVar101[1] = local_468._1_1_;
  auVar101[0] = (undefined1)((short)local_458 >> 7);
  auVar102._2_13_ = auVar101;
  auVar102._0_2_ = CONCAT11((char)local_468,local_458);
  uVar177 = (undefined2)Var72;
  auVar135._0_12_ = auVar102._0_12_;
  auVar135._12_2_ = uVar177;
  auVar135._14_2_ = uVar177;
  auVar134._12_4_ = auVar135._12_4_;
  auVar134._0_10_ = auVar102._0_10_;
  auVar134._10_2_ = auVar100._4_2_;
  auVar133._10_6_ = auVar134._10_6_;
  auVar133._0_8_ = auVar102._0_8_;
  auVar133._8_2_ = auVar100._4_2_;
  auVar80._4_8_ = auVar133._8_8_;
  auVar80._2_2_ = auVar101._0_2_;
  auVar80._0_2_ = auVar101._0_2_;
  iVar178 = (int)CONCAT11((char)local_468,local_458) >> 8;
  iVar179 = auVar80._0_4_ >> 0x18;
  auVar127._0_8_ = CONCAT44(iVar179,iVar178);
  auVar127._8_4_ = auVar133._8_4_ >> 0x18;
  auVar136._12_4_ = auVar134._12_4_ >> 0x18;
  auVar136._0_12_ = auVar127;
  fVar275 = (float)iVar179;
  cVar183 = local_468._1_1_ >> 7;
  auVar32[0xd] = 0;
  auVar32._0_13_ = auVar136._0_13_;
  auVar32[0xe] = cVar183;
  auVar37[0xc] = cVar183;
  auVar37._0_12_ = auVar127;
  auVar37._13_2_ = auVar32._13_2_;
  auVar42[0xb] = 0;
  auVar42._0_11_ = auVar127._0_11_;
  auVar42._12_3_ = auVar37._12_3_;
  auVar47[10] = cVar183;
  auVar47._0_10_ = auVar127._0_10_;
  auVar47._11_4_ = auVar42._11_4_;
  auVar52[9] = 0;
  auVar52._0_9_ = auVar127._0_9_;
  auVar52._10_5_ = auVar47._10_5_;
  auVar57[8] = local_468._1_1_;
  auVar57._0_8_ = auVar127._0_8_;
  auVar57._9_6_ = auVar52._9_6_;
  uVar309 = (undefined1)((uint)uVar22 >> 0x18);
  Var72 = CONCAT81(CONCAT71(auVar57._8_7_,uVar309),(short)(char)local_468 >> 7);
  uVar256 = (undefined1)((uint)uVar22 >> 0x10);
  auVar62._6_9_ = Var72;
  auVar62[5] = uVar256;
  auVar62[4] = (undefined1)((short)(char)local_468 >> 7);
  auVar62._0_4_ = iVar178;
  cVar259 = (char)((uint)uVar22 >> 8);
  auVar81._2_11_ = auVar62._4_11_;
  auVar81[1] = cVar259;
  auVar81[0] = (undefined1)((short)(char)local_468 >> 7);
  cVar255 = (char)uVar22;
  auVar67._2_13_ = auVar81;
  auVar67._0_2_ = CONCAT11(cVar255,(char)local_468);
  uVar177 = (undefined2)Var72;
  auVar139._0_12_ = auVar67._0_12_;
  auVar139._12_2_ = uVar177;
  auVar139._14_2_ = uVar177;
  auVar138._12_4_ = auVar139._12_4_;
  auVar138._0_10_ = auVar67._0_10_;
  auVar138._10_2_ = auVar62._4_2_;
  auVar137._10_6_ = auVar138._10_6_;
  auVar137._0_8_ = auVar67._0_8_;
  auVar137._8_2_ = auVar62._4_2_;
  auVar82._4_8_ = auVar137._8_8_;
  auVar82._2_2_ = auVar81._0_2_;
  auVar82._0_2_ = auVar81._0_2_;
  iVar179 = (int)CONCAT11(cVar255,(char)local_468) >> 8;
  iVar180 = auVar82._0_4_ >> 0x18;
  auVar128._0_8_ = CONCAT44(iVar180,iVar179);
  auVar128._8_4_ = auVar137._8_4_ >> 0x18;
  auVar140._12_4_ = auVar138._12_4_ >> 0x18;
  auVar140._0_12_ = auVar128;
  fVar317 = (float)iVar180;
  cVar183 = cVar259 >> 7;
  auVar33[0xd] = 0;
  auVar33._0_13_ = auVar140._0_13_;
  auVar33[0xe] = cVar183;
  auVar38[0xc] = cVar183;
  auVar38._0_12_ = auVar128;
  auVar38._13_2_ = auVar33._13_2_;
  auVar43[0xb] = 0;
  auVar43._0_11_ = auVar128._0_11_;
  auVar43._12_3_ = auVar38._12_3_;
  auVar48[10] = cVar183;
  auVar48._0_10_ = auVar128._0_10_;
  auVar48._11_4_ = auVar43._11_4_;
  auVar53[9] = 0;
  auVar53._0_9_ = auVar128._0_9_;
  auVar53._10_5_ = auVar48._10_5_;
  auVar58[8] = cVar259;
  auVar58._0_8_ = auVar128._0_8_;
  auVar58._9_6_ = auVar53._9_6_;
  Var72 = CONCAT81(CONCAT71(auVar58._8_7_,(char)((uint)uVar23 >> 0x18)),(short)cVar255 >> 7);
  auVar63._6_9_ = Var72;
  auVar63[5] = (char)((uint)uVar23 >> 0x10);
  auVar63[4] = (undefined1)((short)cVar255 >> 7);
  auVar63._0_4_ = iVar179;
  auVar83._2_11_ = auVar63._4_11_;
  auVar83[1] = (char)((uint)uVar23 >> 8);
  auVar83[0] = (undefined1)((short)cVar255 >> 7);
  sVar122 = CONCAT11((char)uVar23,cVar255);
  auVar68._2_13_ = auVar83;
  auVar68._0_2_ = sVar122;
  uVar177 = (undefined2)Var72;
  auVar143._0_12_ = auVar68._0_12_;
  auVar143._12_2_ = uVar177;
  auVar143._14_2_ = uVar177;
  auVar142._12_4_ = auVar143._12_4_;
  auVar142._0_10_ = auVar68._0_10_;
  auVar142._10_2_ = auVar63._4_2_;
  auVar141._10_6_ = auVar142._10_6_;
  auVar141._0_8_ = auVar68._0_8_;
  auVar141._8_2_ = auVar63._4_2_;
  auVar84._4_8_ = auVar141._8_8_;
  auVar84._2_2_ = auVar83._0_2_;
  auVar84._0_2_ = auVar83._0_2_;
  fVar124 = (float)((int)sVar122 >> 8);
  fVar181 = (float)(auVar84._0_4_ >> 0x18);
  fVar184 = (float)(auVar141._8_4_ >> 0x18);
  uVar177 = CONCAT11((char)((uint)uVar18 >> 0x18),uVar309);
  uVar186 = CONCAT35(CONCAT21(uVar177,(char)((uint)uVar18 >> 0x10)),CONCAT14(uVar256,uVar22));
  uVar70 = CONCAT51(CONCAT41((int)((ulong)uVar186 >> 0x20),(char)((uint)uVar18 >> 8)),cVar259);
  sVar122 = CONCAT11((char)uVar18,cVar255);
  uVar112 = CONCAT62(uVar70,sVar122);
  auVar303._8_4_ = 0;
  auVar303._0_8_ = uVar112;
  auVar303._12_2_ = uVar177;
  auVar303._14_2_ = uVar177;
  uVar177 = (undefined2)((ulong)uVar186 >> 0x20);
  auVar302._12_4_ = auVar303._12_4_;
  auVar302._8_2_ = 0;
  auVar302._0_8_ = uVar112;
  auVar302._10_2_ = uVar177;
  auVar301._10_6_ = auVar302._10_6_;
  auVar301._8_2_ = uVar177;
  auVar301._0_8_ = uVar112;
  uVar177 = (undefined2)uVar70;
  auVar85._4_8_ = auVar301._8_8_;
  auVar85._2_2_ = uVar177;
  auVar85._0_2_ = uVar177;
  fVar368 = (float)((int)sVar122 >> 8);
  fVar378 = (float)(auVar85._0_4_ >> 0x18);
  fVar381 = (float)(auVar301._8_4_ >> 0x18);
  fVar403 = fVar350 * (float)iVar257 + fVar357 * (float)iVar226 + fVar361 * (float)iVar227;
  fVar408 = fVar350 * fVar324 + fVar357 * fVar341 + fVar361 * fVar390;
  fVar411 = fVar350 * (float)auVar126._8_4_ +
            fVar357 * (float)auVar229._8_4_ + fVar361 * (float)auVar230._8_4_;
  fVar413 = fVar350 * (float)auVar132._12_4_ +
            fVar357 * (float)auVar235._12_4_ + fVar361 * (float)auVar239._12_4_;
  fVar391 = fVar350 * (float)iVar178 + fVar357 * (float)iVar228 + fVar361 * fVar311;
  fVar397 = fVar350 * fVar275 + fVar357 * fVar334 + fVar361 * fVar316;
  fVar399 = fVar350 * (float)auVar127._8_4_ + fVar357 * (float)auVar231._8_4_ + fVar361 * fVar320;
  fVar401 = fVar350 * (float)auVar136._12_4_ +
            fVar357 * (float)auVar243._12_4_ + fVar361 * (float)(auVar245._12_4_ >> 0x18);
  fVar279 = fVar350 * (float)iVar179 + fVar357 * fVar124 + fVar361 * fVar368;
  fVar295 = fVar350 * fVar317 + fVar357 * fVar181 + fVar361 * fVar378;
  fVar297 = fVar350 * (float)auVar128._8_4_ + fVar357 * fVar184 + fVar361 * fVar381;
  fVar350 = fVar350 * (float)auVar140._12_4_ +
            fVar357 * (float)(auVar142._12_4_ >> 0x18) + fVar361 * (float)(auVar302._12_4_ >> 0x18);
  uVar186 = *(undefined8 *)(prim + uVar106 * 7 + 6);
  uStack_390 = 0;
  uVar10 = *(undefined8 *)(prim + uVar106 * 0xb + 6);
  fStack_410 = 0.0;
  fStack_40c = 0.0;
  auVar326._0_4_ = (float)iVar228 * fVar221 + fVar311 * fVar223;
  fVar335 = fVar334 * fVar221 + fVar316 * fVar223;
  auVar325._0_8_ = CONCAT44(fVar335,auVar326._0_4_);
  auVar325._8_4_ = (float)auVar231._8_4_ * fVar221 + fVar320 * fVar223;
  uVar11 = *(undefined8 *)(prim + uVar106 * 9 + 6);
  uVar12 = *(undefined8 *)(prim + uVar106 * 0xd + 6);
  uVar13 = *(undefined8 *)(prim + uVar106 * 0x12 + 6);
  fVar361 = (float)iVar257 * fVar188 + (float)iVar226 * fVar221 + (float)iVar227 * fVar223;
  fVar311 = fVar324 * fVar188 + fVar341 * fVar221 + fVar390 * fVar223;
  fVar316 = (float)auVar126._8_4_ * fVar188 +
            (float)auVar229._8_4_ * fVar221 + (float)auVar230._8_4_ * fVar223;
  fVar324 = (float)auVar132._12_4_ * fVar188 +
            (float)auVar235._12_4_ * fVar221 + (float)auVar239._12_4_ * fVar223;
  fVar351 = (float)iVar178 * fVar188 + auVar326._0_4_;
  fVar358 = fVar275 * fVar188 + fVar335;
  fVar362 = (float)auVar127._8_4_ * fVar188 + auVar325._8_4_;
  fVar365 = (float)auVar136._12_4_ * fVar188 +
            (float)auVar243._12_4_ * fVar221 + (float)(auVar245._12_4_ >> 0x18) * fVar223;
  fVar390 = fVar188 * (float)iVar179 + fVar221 * fVar124 + fVar223 * fVar368;
  fVar258 = fVar188 * fVar317 + fVar221 * fVar181 + fVar223 * fVar378;
  fVar260 = fVar188 * (float)auVar128._8_4_ + fVar221 * fVar184 + fVar223 * fVar381;
  fVar261 = fVar188 * (float)auVar140._12_4_ +
            fVar221 * (float)(auVar142._12_4_ >> 0x18) + fVar223 * (float)(auVar302._12_4_ >> 0x18);
  fVar124 = (float)DAT_01f4bd50;
  fVar181 = DAT_01f4bd50._4_4_;
  fVar184 = DAT_01f4bd50._8_4_;
  fVar188 = DAT_01f4bd50._12_4_;
  uVar117 = -(uint)(fVar124 <= ABS(fVar403));
  uVar118 = -(uint)(fVar181 <= ABS(fVar408));
  uVar119 = -(uint)(fVar184 <= ABS(fVar411));
  uVar120 = -(uint)(fVar188 <= ABS(fVar413));
  auVar406._0_4_ = (uint)fVar403 & uVar117;
  auVar406._4_4_ = (uint)fVar408 & uVar118;
  auVar406._8_4_ = (uint)fVar411 & uVar119;
  auVar406._12_4_ = (uint)fVar413 & uVar120;
  auVar144._0_4_ = ~uVar117 & (uint)fVar124;
  auVar144._4_4_ = ~uVar118 & (uint)fVar181;
  auVar144._8_4_ = ~uVar119 & (uint)fVar184;
  auVar144._12_4_ = ~uVar120 & (uint)fVar188;
  auVar144 = auVar144 | auVar406;
  uVar117 = -(uint)(fVar124 <= ABS(fVar391));
  uVar118 = -(uint)(fVar181 <= ABS(fVar397));
  uVar119 = -(uint)(fVar184 <= ABS(fVar399));
  uVar120 = -(uint)(fVar188 <= ABS(fVar401));
  auVar393._0_4_ = (uint)fVar391 & uVar117;
  auVar393._4_4_ = (uint)fVar397 & uVar118;
  auVar393._8_4_ = (uint)fVar399 & uVar119;
  auVar393._12_4_ = (uint)fVar401 & uVar120;
  auVar323._0_4_ = ~uVar117 & (uint)fVar124;
  auVar323._4_4_ = ~uVar118 & (uint)fVar181;
  auVar323._8_4_ = ~uVar119 & (uint)fVar184;
  auVar323._12_4_ = ~uVar120 & (uint)fVar188;
  auVar323 = auVar323 | auVar393;
  uVar117 = -(uint)(fVar124 <= ABS(fVar279));
  uVar118 = -(uint)(fVar181 <= ABS(fVar295));
  uVar119 = -(uint)(fVar184 <= ABS(fVar297));
  uVar120 = -(uint)(fVar188 <= ABS(fVar350));
  auVar281._0_4_ = (uint)fVar279 & uVar117;
  auVar281._4_4_ = (uint)fVar295 & uVar118;
  auVar281._8_4_ = (uint)fVar297 & uVar119;
  auVar281._12_4_ = (uint)fVar350 & uVar120;
  auVar385._0_4_ = ~uVar117 & (uint)fVar124;
  auVar385._4_4_ = ~uVar118 & (uint)fVar181;
  auVar385._8_4_ = ~uVar119 & (uint)fVar184;
  auVar385._12_4_ = ~uVar120 & (uint)fVar188;
  auVar385 = auVar385 | auVar281;
  auVar190 = rcpps(_DAT_01f4bd50,auVar144);
  fVar357 = auVar190._0_4_;
  auVar145._0_4_ = auVar144._0_4_ * fVar357;
  fVar368 = auVar190._4_4_;
  auVar145._4_4_ = auVar144._4_4_ * fVar368;
  fVar378 = auVar190._8_4_;
  auVar145._8_4_ = auVar144._8_4_ * fVar378;
  fVar381 = auVar190._12_4_;
  auVar145._12_4_ = auVar144._12_4_ * fVar381;
  auVar282._0_4_ = (float)DAT_01f46a60;
  fVar188 = DAT_01f46a60._4_4_;
  auVar285._0_12_ = DAT_01f46a60._0_12_;
  fVar221 = DAT_01f46a60._12_4_;
  fVar223 = DAT_01f46a60._8_4_;
  fVar357 = (auVar282._0_4_ - auVar145._0_4_) * fVar357 + fVar357;
  fVar368 = (fVar188 - auVar145._4_4_) * fVar368 + fVar368;
  fVar378 = (fVar223 - auVar145._8_4_) * fVar378 + fVar378;
  fVar381 = (fVar221 - auVar145._12_4_) * fVar381 + fVar381;
  auVar190 = rcpps(auVar145,auVar323);
  fVar124 = auVar190._0_4_;
  fVar181 = auVar190._4_4_;
  fVar295 = auVar190._8_4_;
  fVar334 = auVar190._12_4_;
  fVar124 = (auVar282._0_4_ - auVar323._0_4_ * fVar124) * fVar124 + fVar124;
  fVar181 = (fVar188 - auVar323._4_4_ * fVar181) * fVar181 + fVar181;
  fVar295 = (fVar223 - auVar323._8_4_ * fVar295) * fVar295 + fVar295;
  fVar334 = (fVar221 - auVar323._12_4_ * fVar334) * fVar334 + fVar334;
  auVar190 = rcpps(auVar190,auVar385);
  auVar146._0_4_ = auVar190._0_4_;
  fVar184 = auVar190._4_4_;
  fVar297 = auVar190._8_4_;
  fVar341 = auVar190._12_4_;
  uVar112 = *(ulong *)(prim + uVar106 * 0x16 + 6);
  fVar391 = (auVar282._0_4_ - auVar385._0_4_ * auVar146._0_4_) * auVar146._0_4_ + auVar146._0_4_;
  fVar184 = (fVar188 - auVar385._4_4_ * fVar184) * fVar184 + fVar184;
  fVar297 = (fVar223 - auVar385._8_4_ * fVar297) * fVar297 + fVar297;
  fVar341 = (fVar221 - auVar385._12_4_ * fVar341) * fVar341 + fVar341;
  local_398._0_2_ = (short)uVar186;
  local_398._2_2_ = (undefined2)((ulong)uVar186 >> 0x10);
  local_398._4_2_ = (undefined2)((ulong)uVar186 >> 0x20);
  local_398._6_2_ = (undefined2)((ulong)uVar186 >> 0x30);
  auVar149._0_12_ = auVar190._0_12_;
  auVar149._12_2_ = auVar190._6_2_;
  auVar149._14_2_ = local_398._6_2_;
  auVar148._12_4_ = auVar149._12_4_;
  auVar148._0_10_ = auVar190._0_10_;
  auVar148._10_2_ = local_398._4_2_;
  auVar147._10_6_ = auVar148._10_6_;
  auVar147._0_8_ = auVar190._0_8_;
  auVar147._8_2_ = auVar190._4_2_;
  auVar146._8_8_ = auVar147._8_8_;
  auVar146._6_2_ = local_398._2_2_;
  auVar146._4_2_ = auVar190._2_2_;
  auVar150._0_4_ = (float)(int)(short)local_398;
  fVar188 = (float)(auVar146._4_4_ >> 0x10);
  auVar129._0_8_ = CONCAT44(fVar188,auVar150._0_4_);
  auVar129._8_4_ = (float)(auVar147._8_4_ >> 0x10);
  local_418._0_2_ = (short)uVar10;
  local_418._2_2_ = (undefined2)((ulong)uVar10 >> 0x10);
  local_418._4_2_ = (undefined2)((ulong)uVar10 >> 0x20);
  local_418._6_2_ = (undefined2)((ulong)uVar10 >> 0x30);
  auVar285._12_2_ = DAT_01f46a60._6_2_;
  auVar285._14_2_ = local_418._6_2_;
  auVar284._12_4_ = auVar285._12_4_;
  auVar284._0_10_ = (unkbyte10)DAT_01f46a60;
  auVar284._10_2_ = local_418._4_2_;
  auVar283._10_6_ = auVar284._10_6_;
  auVar283._0_8_ = (undefined8)DAT_01f46a60;
  auVar283._8_2_ = DAT_01f46a60._4_2_;
  auVar282._8_8_ = auVar283._8_8_;
  auVar282._6_2_ = local_418._2_2_;
  auVar282._4_2_ = DAT_01f46a60._2_2_;
  auVar153._12_2_ = (short)((uint)fVar188 >> 0x10);
  auVar153._0_12_ = auVar129;
  auVar153._14_2_ = (short)((ulong)uVar11 >> 0x30);
  auVar152._12_4_ = auVar153._12_4_;
  auVar152._0_10_ = auVar129._0_10_;
  auVar152._10_2_ = (short)((ulong)uVar11 >> 0x20);
  auVar151._10_6_ = auVar152._10_6_;
  auVar151._8_2_ = SUB42(fVar188,0);
  auVar151._0_8_ = auVar129._0_8_;
  auVar150._8_8_ = auVar151._8_8_;
  auVar150._6_2_ = (short)((ulong)uVar11 >> 0x10);
  auVar150._4_2_ = (short)((uint)auVar150._0_4_ >> 0x10);
  auVar154._0_4_ = (float)(int)(short)uVar11;
  fVar221 = (float)(auVar150._4_4_ >> 0x10);
  auVar130._0_8_ = CONCAT44(fVar221,auVar154._0_4_);
  auVar130._8_4_ = (float)(auVar151._8_4_ >> 0x10);
  auVar329._12_2_ = (short)((uint)fVar335 >> 0x10);
  auVar329._0_12_ = auVar325;
  auVar329._14_2_ = (short)((ulong)uVar12 >> 0x30);
  auVar328._12_4_ = auVar329._12_4_;
  auVar328._0_10_ = auVar325._0_10_;
  auVar328._10_2_ = (short)((ulong)uVar12 >> 0x20);
  auVar327._10_6_ = auVar328._10_6_;
  auVar327._8_2_ = SUB42(fVar335,0);
  auVar327._0_8_ = auVar325._0_8_;
  auVar326._8_8_ = auVar327._8_8_;
  auVar326._6_2_ = (short)((ulong)uVar12 >> 0x10);
  auVar326._4_2_ = (short)((uint)auVar326._0_4_ >> 0x10);
  local_478._0_2_ = (undefined2)uVar13;
  local_478._2_2_ = (undefined2)((ulong)uVar13 >> 0x10);
  local_478._4_2_ = (undefined2)((ulong)uVar13 >> 0x20);
  uStack_472 = (undefined2)((ulong)uVar13 >> 0x30);
  auVar157._12_2_ = (short)((uint)fVar221 >> 0x10);
  auVar157._0_12_ = auVar130;
  auVar157._14_2_ = uStack_472;
  auVar156._12_4_ = auVar157._12_4_;
  auVar156._0_10_ = auVar130._0_10_;
  auVar156._10_2_ = local_478._4_2_;
  auVar155._10_6_ = auVar156._10_6_;
  auVar155._8_2_ = SUB42(fVar221,0);
  auVar155._0_8_ = auVar130._0_8_;
  auVar154._8_8_ = auVar155._8_8_;
  auVar154._6_2_ = local_478._2_2_;
  auVar154._4_2_ = (short)((uint)auVar154._0_4_ >> 0x10);
  fVar223 = (float)(auVar154._4_4_ >> 0x10);
  fVar350 = (float)(auVar155._8_4_ >> 0x10);
  uVar177 = (undefined2)(uVar112 >> 0x30);
  auVar193._8_4_ = 0;
  auVar193._0_8_ = uVar112;
  auVar193._12_2_ = uVar177;
  auVar193._14_2_ = uVar177;
  uVar177 = (undefined2)(uVar112 >> 0x20);
  auVar192._12_4_ = auVar193._12_4_;
  auVar192._8_2_ = 0;
  auVar192._0_8_ = uVar112;
  auVar192._10_2_ = uVar177;
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._8_2_ = uVar177;
  auVar191._0_8_ = uVar112;
  uVar177 = (undefined2)(uVar112 >> 0x10);
  auVar86._4_8_ = auVar191._8_8_;
  auVar86._2_2_ = uVar177;
  auVar86._0_2_ = uVar177;
  uVar108 = *(ulong *)(prim + uVar106 * 0x14 + 6);
  uVar177 = (undefined2)(uVar108 >> 0x30);
  auVar160._8_4_ = 0;
  auVar160._0_8_ = uVar108;
  auVar160._12_2_ = uVar177;
  auVar160._14_2_ = uVar177;
  uVar177 = (undefined2)(uVar108 >> 0x20);
  auVar159._12_4_ = auVar160._12_4_;
  auVar159._8_2_ = 0;
  auVar159._0_8_ = uVar108;
  auVar159._10_2_ = uVar177;
  auVar158._10_6_ = auVar159._10_6_;
  auVar158._8_2_ = uVar177;
  auVar158._0_8_ = uVar108;
  uVar177 = (undefined2)(uVar108 >> 0x10);
  auVar87._4_8_ = auVar158._8_8_;
  auVar87._2_2_ = uVar177;
  auVar87._0_2_ = uVar177;
  fVar275 = (float)(auVar87._0_4_ >> 0x10);
  fVar317 = (float)(auVar158._8_4_ >> 0x10);
  uVar110 = *(ulong *)(prim + uVar106 * 0x18 + 6);
  uVar177 = (undefined2)(uVar110 >> 0x30);
  auVar196._8_4_ = 0;
  auVar196._0_8_ = uVar110;
  auVar196._12_2_ = uVar177;
  auVar196._14_2_ = uVar177;
  uVar177 = (undefined2)(uVar110 >> 0x20);
  auVar195._12_4_ = auVar196._12_4_;
  auVar195._8_2_ = 0;
  auVar195._0_8_ = uVar110;
  auVar195._10_2_ = uVar177;
  auVar194._10_6_ = auVar195._10_6_;
  auVar194._8_2_ = uVar177;
  auVar194._0_8_ = uVar110;
  uVar177 = (undefined2)(uVar110 >> 0x10);
  auVar88._4_8_ = auVar194._8_8_;
  auVar88._2_2_ = uVar177;
  auVar88._0_2_ = uVar177;
  uVar14 = *(ulong *)(prim + uVar106 * 0x1d + 6);
  uVar177 = (undefined2)(uVar14 >> 0x30);
  auVar163._8_4_ = 0;
  auVar163._0_8_ = uVar14;
  auVar163._12_2_ = uVar177;
  auVar163._14_2_ = uVar177;
  uVar177 = (undefined2)(uVar14 >> 0x20);
  auVar162._12_4_ = auVar163._12_4_;
  auVar162._8_2_ = 0;
  auVar162._0_8_ = uVar14;
  auVar162._10_2_ = uVar177;
  auVar161._10_6_ = auVar162._10_6_;
  auVar161._8_2_ = uVar177;
  auVar161._0_8_ = uVar14;
  uVar177 = (undefined2)(uVar14 >> 0x10);
  auVar89._4_8_ = auVar161._8_8_;
  auVar89._2_2_ = uVar177;
  auVar89._0_2_ = uVar177;
  fVar279 = (float)(auVar89._0_4_ >> 0x10);
  fVar320 = (float)(auVar161._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar106 * 0x21 + 6);
  uVar177 = (undefined2)(uVar15 >> 0x30);
  auVar199._8_4_ = 0;
  auVar199._0_8_ = uVar15;
  auVar199._12_2_ = uVar177;
  auVar199._14_2_ = uVar177;
  uVar177 = (undefined2)(uVar15 >> 0x20);
  auVar198._12_4_ = auVar199._12_4_;
  auVar198._8_2_ = 0;
  auVar198._0_8_ = uVar15;
  auVar198._10_2_ = uVar177;
  auVar197._10_6_ = auVar198._10_6_;
  auVar197._8_2_ = uVar177;
  auVar197._0_8_ = uVar15;
  uVar177 = (undefined2)(uVar15 >> 0x10);
  auVar90._4_8_ = auVar197._8_8_;
  auVar90._2_2_ = uVar177;
  auVar90._0_2_ = uVar177;
  uVar16 = *(ulong *)(prim + uVar106 * 0x1f + 6);
  uVar177 = (undefined2)(uVar16 >> 0x30);
  auVar166._8_4_ = 0;
  auVar166._0_8_ = uVar16;
  auVar166._12_2_ = uVar177;
  auVar166._14_2_ = uVar177;
  uVar177 = (undefined2)(uVar16 >> 0x20);
  auVar165._12_4_ = auVar166._12_4_;
  auVar165._8_2_ = 0;
  auVar165._0_8_ = uVar16;
  auVar165._10_2_ = uVar177;
  auVar164._10_6_ = auVar165._10_6_;
  auVar164._8_2_ = uVar177;
  auVar164._0_8_ = uVar16;
  uVar177 = (undefined2)(uVar16 >> 0x10);
  auVar91._4_8_ = auVar164._8_8_;
  auVar91._2_2_ = uVar177;
  auVar91._0_2_ = uVar177;
  fVar335 = (float)(auVar91._0_4_ >> 0x10);
  fVar397 = (float)(auVar164._8_4_ >> 0x10);
  uVar106 = *(ulong *)(prim + uVar106 * 0x23 + 6);
  uVar177 = (undefined2)(uVar106 >> 0x30);
  auVar169._8_4_ = 0;
  auVar169._0_8_ = uVar106;
  auVar169._12_2_ = uVar177;
  auVar169._14_2_ = uVar177;
  uVar177 = (undefined2)(uVar106 >> 0x20);
  auVar168._12_4_ = auVar169._12_4_;
  auVar168._8_2_ = 0;
  auVar168._0_8_ = uVar106;
  auVar168._10_2_ = uVar177;
  auVar167._10_6_ = auVar168._10_6_;
  auVar167._8_2_ = uVar177;
  auVar167._0_8_ = uVar106;
  uVar177 = (undefined2)(uVar106 >> 0x10);
  auVar92._4_8_ = auVar167._8_8_;
  auVar92._2_2_ = uVar177;
  auVar92._0_2_ = uVar177;
  auVar286._0_8_ =
       CONCAT44(((((float)(auVar282._4_4_ >> 0x10) - fVar188) * fVar123 + fVar188) - fVar311) *
                fVar368,((((float)(int)(short)local_418 - auVar150._0_4_) * fVar123 + auVar150._0_4_
                         ) - fVar361) * fVar357);
  auVar286._8_4_ =
       ((((float)(auVar283._8_4_ >> 0x10) - auVar129._8_4_) * fVar123 + auVar129._8_4_) - fVar316) *
       fVar378;
  auVar286._12_4_ =
       ((((float)(auVar284._12_4_ >> 0x10) - (float)(auVar148._12_4_ >> 0x10)) * fVar123 +
        (float)(auVar148._12_4_ >> 0x10)) - fVar324) * fVar381;
  local_3f8._0_4_ =
       ((((float)(int)(short)uVar12 - auVar154._0_4_) * fVar123 + auVar154._0_4_) - fVar361) *
       fVar357;
  local_3f8._4_4_ =
       ((((float)(auVar326._4_4_ >> 0x10) - fVar221) * fVar123 + fVar221) - fVar311) * fVar368;
  local_3f8._8_4_ =
       ((((float)(auVar327._8_4_ >> 0x10) - auVar130._8_4_) * fVar123 + auVar130._8_4_) - fVar316) *
       fVar378;
  local_3f8._12_4_ =
       ((((float)(auVar328._12_4_ >> 0x10) - (float)(auVar152._12_4_ >> 0x10)) * fVar123 +
        (float)(auVar152._12_4_ >> 0x10)) - fVar324) * fVar381;
  auVar339._0_8_ =
       CONCAT44(((((float)(auVar86._0_4_ >> 0x10) - fVar223) * fVar123 + fVar223) - fVar358) *
                fVar181,((((float)(int)(short)uVar112 - (float)(int)(short)local_478._0_2_) *
                          fVar123 + (float)(int)(short)local_478._0_2_) - fVar351) * fVar124);
  auVar339._8_4_ =
       ((((float)(auVar191._8_4_ >> 0x10) - fVar350) * fVar123 + fVar350) - fVar362) * fVar295;
  auVar339._12_4_ =
       ((((float)(auVar192._12_4_ >> 0x10) - (float)(auVar156._12_4_ >> 0x10)) * fVar123 +
        (float)(auVar156._12_4_ >> 0x10)) - fVar365) * fVar334;
  local_3e8._0_4_ =
       ((((float)(int)(short)uVar110 - (float)(int)(short)uVar108) * fVar123 +
        (float)(int)(short)uVar108) - fVar351) * fVar124;
  local_3e8._4_4_ =
       ((((float)(auVar88._0_4_ >> 0x10) - fVar275) * fVar123 + fVar275) - fVar358) * fVar181;
  local_3e8._8_4_ =
       ((((float)(auVar194._8_4_ >> 0x10) - fVar317) * fVar123 + fVar317) - fVar362) * fVar295;
  local_3e8._12_4_ =
       ((((float)(auVar195._12_4_ >> 0x10) - (float)(auVar159._12_4_ >> 0x10)) * fVar123 +
        (float)(auVar159._12_4_ >> 0x10)) - fVar365) * fVar334;
  auVar354._0_8_ =
       CONCAT44(((((float)(auVar90._0_4_ >> 0x10) - fVar279) * fVar123 + fVar279) - fVar258) *
                fVar184,((((float)(int)(short)uVar15 - (float)(int)(short)uVar14) * fVar123 +
                         (float)(int)(short)uVar14) - fVar390) * fVar391);
  auVar354._8_4_ =
       ((((float)(auVar197._8_4_ >> 0x10) - fVar320) * fVar123 + fVar320) - fVar260) * fVar297;
  auVar354._12_4_ =
       ((((float)(auVar198._12_4_ >> 0x10) - (float)(auVar162._12_4_ >> 0x10)) * fVar123 +
        (float)(auVar162._12_4_ >> 0x10)) - fVar261) * fVar341;
  auVar371._0_4_ =
       ((((float)(int)(short)uVar106 - (float)(int)(short)uVar16) * fVar123 +
        (float)(int)(short)uVar16) - fVar390) * fVar391;
  auVar371._4_4_ =
       ((((float)(auVar92._0_4_ >> 0x10) - fVar335) * fVar123 + fVar335) - fVar258) * fVar184;
  auVar371._8_4_ =
       ((((float)(auVar167._8_4_ >> 0x10) - fVar397) * fVar123 + fVar397) - fVar260) * fVar297;
  auVar371._12_4_ =
       ((((float)(auVar168._12_4_ >> 0x10) - (float)(auVar165._12_4_ >> 0x10)) * fVar123 +
        (float)(auVar165._12_4_ >> 0x10)) - fVar261) * fVar341;
  auVar263._8_4_ = auVar286._8_4_;
  auVar263._0_8_ = auVar286._0_8_;
  auVar263._12_4_ = auVar286._12_4_;
  auVar264 = minps(auVar263,(undefined1  [16])local_3f8);
  auVar200._8_4_ = auVar339._8_4_;
  auVar200._0_8_ = auVar339._0_8_;
  auVar200._12_4_ = auVar339._12_4_;
  auVar190 = minps(auVar200,(undefined1  [16])local_3e8);
  auVar264 = maxps(auVar264,auVar190);
  auVar201._8_4_ = auVar354._8_4_;
  auVar201._0_8_ = auVar354._0_8_;
  auVar201._12_4_ = auVar354._12_4_;
  auVar190 = minps(auVar201,auVar371);
  uVar111 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar247._4_4_ = uVar111;
  auVar247._0_4_ = uVar111;
  auVar247._8_4_ = uVar111;
  auVar247._12_4_ = uVar111;
  auVar190 = maxps(auVar190,auVar247);
  auVar190 = maxps(auVar264,auVar190);
  fVar123 = auVar190._0_4_ * 0.99999964;
  fVar124 = auVar190._4_4_ * 0.99999964;
  fVar181 = auVar190._8_4_ * 0.99999964;
  fVar311 = auVar190._12_4_ * 0.99999964;
  auVar190 = maxps(auVar286,(undefined1  [16])local_3f8);
  auVar264 = maxps(auVar339,(undefined1  [16])local_3e8);
  auVar190 = minps(auVar190,auVar264);
  auVar264 = maxps(auVar354,auVar371);
  fVar361 = (ray->super_RayK<1>).tfar;
  auVar202._4_4_ = fVar361;
  auVar202._0_4_ = fVar361;
  auVar202._8_4_ = fVar361;
  auVar202._12_4_ = fVar361;
  auVar264 = minps(auVar264,auVar202);
  auVar190 = minps(auVar190,auVar264);
  auVar203._0_4_ = -(uint)(PVar17 != (Primitive)0x0 && fVar123 <= auVar190._0_4_ * 1.0000004);
  auVar203._4_4_ = -(uint)(1 < (byte)PVar17 && fVar124 <= auVar190._4_4_ * 1.0000004);
  auVar203._8_4_ = -(uint)(2 < (byte)PVar17 && fVar181 <= auVar190._8_4_ * 1.0000004);
  auVar203._12_4_ = -(uint)(3 < (byte)PVar17 && fVar311 <= auVar190._12_4_ * 1.0000004);
  uVar111 = movmskps((int)unaff_RBP,auVar203);
  uVar112 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),uVar111);
  local_418 = uVar10;
  local_398 = uVar186;
  local_210 = ray;
  local_170 = prim;
  do {
    if (uVar112 == 0) {
      return;
    }
    lVar115 = 0;
    if (uVar112 != 0) {
      for (; (uVar112 >> lVar115 & 1) == 0; lVar115 = lVar115 + 1) {
      }
    }
    local_3b0 = (RTCIntersectArguments *)(ulong)*(uint *)(local_170 + 2);
    local_370 = (ulong)*(uint *)(local_170 + lVar115 * 4 + 6);
    pGVar24 = (context->scene->geometries).items[(long)local_3b0].ptr;
    uVar108 = (ulong)*(uint *)(*(long *)&pGVar24->field_0x58 +
                              local_370 *
                              pGVar24[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar361 = pGVar24->fnumTimeSegments;
    fVar184 = (pGVar24->time_range).lower;
    fVar188 = (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar184) /
              ((pGVar24->time_range).upper - fVar184)) * fVar361;
    fVar184 = floorf(fVar188);
    fVar361 = fVar361 + -1.0;
    if (fVar361 <= fVar184) {
      fVar184 = fVar361;
    }
    fVar361 = 0.0;
    if (0.0 <= fVar184) {
      fVar361 = fVar184;
    }
    _Var25 = pGVar24[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar113 = (long)(int)fVar361 * 0x38;
    lVar115 = *(long *)(_Var25 + lVar113);
    lVar114 = *(long *)(_Var25 + 0x10 + lVar113);
    uVar110 = *(ulong *)(_Var25 + 0x38 + lVar113);
    lVar113 = *(long *)(_Var25 + 0x48 + lVar113);
    pRVar109 = (RTCIntersectArguments *)(lVar114 * (uVar108 + 3));
    pfVar1 = (float *)(uVar110 + uVar108 * lVar113);
    pfVar2 = (float *)(lVar115 + lVar114 * uVar108);
    pfVar3 = (float *)(uVar110 + (uVar108 + 1) * lVar113);
    pfVar4 = (float *)(lVar115 + lVar114 * (uVar108 + 1));
    pfVar5 = (float *)(uVar110 + (uVar108 + 2) * lVar113);
    pfVar6 = (float *)(lVar115 + lVar114 * (uVar108 + 2));
    fVar188 = fVar188 - fVar361;
    fVar361 = 1.0 - fVar188;
    fVar258 = *pfVar2 * fVar361 + *pfVar1 * fVar188;
    fVar260 = pfVar2[1] * fVar361 + pfVar1[1] * fVar188;
    fVar261 = pfVar2[2] * fVar361 + pfVar1[2] * fVar188;
    fVar391 = pfVar2[3] * fVar361 + pfVar1[3] * fVar188;
    fVar403 = *pfVar4 * fVar361 + *pfVar3 * fVar188;
    fVar408 = pfVar4[1] * fVar361 + pfVar3[1] * fVar188;
    fVar411 = pfVar4[2] * fVar361 + pfVar3[2] * fVar188;
    fVar413 = pfVar4[3] * fVar361 + pfVar3[3] * fVar188;
    fVar365 = *pfVar6 * fVar361 + *pfVar5 * fVar188;
    fVar397 = pfVar6[1] * fVar361 + pfVar5[1] * fVar188;
    fVar399 = pfVar6[2] * fVar361 + pfVar5[2] * fVar188;
    fVar401 = pfVar6[3] * fVar361 + pfVar5[3] * fVar188;
    pfVar1 = (float *)(uVar110 + lVar113 * (uVar108 + 3));
    pfVar2 = (float *)((long)&pRVar109->flags + lVar115);
    fVar335 = fVar361 * *pfVar2 + fVar188 * *pfVar1;
    fVar351 = fVar361 * pfVar2[1] + fVar188 * pfVar1[1];
    fVar358 = fVar361 * pfVar2[2] + fVar188 * pfVar1[2];
    fVar362 = fVar361 * pfVar2[3] + fVar188 * pfVar1[3];
    fVar361 = (ray->super_RayK<1>).org.field_0.m128[0];
    fVar184 = (ray->super_RayK<1>).org.field_0.m128[1];
    fVar188 = (ray->super_RayK<1>).org.field_0.m128[2];
    local_1e8 = (ray->super_RayK<1>).org.field_0.m128[3];
    fVar320 = fVar258 - fVar361;
    fVar324 = fVar260 - fVar184;
    fVar334 = fVar261 - fVar188;
    fVar221 = (pre->ray_space).vx.field_0.m128[0];
    fVar223 = (pre->ray_space).vx.field_0.m128[1];
    fVar275 = (pre->ray_space).vx.field_0.m128[2];
    fVar279 = (pre->ray_space).vy.field_0.m128[0];
    fVar316 = (pre->ray_space).vy.field_0.m128[1];
    fVar295 = (pre->ray_space).vy.field_0.m128[2];
    fVar297 = (pre->ray_space).vz.field_0.m128[0];
    fVar350 = (pre->ray_space).vz.field_0.m128[1];
    fVar317 = (pre->ray_space).vz.field_0.m128[2];
    fVar357 = fVar320 * fVar221 + fVar324 * fVar279 + fVar334 * fVar297;
    local_188 = fVar320 * fVar223 + fVar324 * fVar316 + fVar334 * fVar350;
    fVar381 = fVar320 * fVar275 + fVar324 * fVar295 + fVar334 * fVar317;
    fVar320 = fVar403 - fVar361;
    fVar324 = fVar408 - fVar184;
    fVar334 = fVar411 - fVar188;
    fVar368 = fVar320 * fVar221 + fVar324 * fVar279 + fVar334 * fVar297;
    fVar378 = fVar320 * fVar223 + fVar324 * fVar316 + fVar334 * fVar350;
    fVar390 = fVar320 * fVar275 + fVar324 * fVar295 + fVar334 * fVar317;
    fVar324 = fVar365 - fVar361;
    fVar334 = fVar397 - fVar184;
    fVar341 = fVar399 - fVar188;
    fVar320 = fVar324 * fVar221 + fVar334 * fVar279 + fVar341 * fVar297;
    local_428 = fVar324 * fVar223 + fVar334 * fVar316 + fVar341 * fVar350;
    local_1d8 = fVar324 * fVar275 + fVar334 * fVar295 + fVar341 * fVar317;
    fVar361 = fVar335 - fVar361;
    fVar184 = fVar351 - fVar184;
    fVar188 = fVar358 - fVar188;
    iVar257 = (int)pGVar24[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    fVar221 = fVar361 * fVar221 + fVar184 * fVar279 + fVar188 * fVar297;
    local_438 = fVar361 * fVar223 + fVar184 * fVar316 + fVar188 * fVar350;
    fVar184 = fVar361 * fVar275 + fVar184 * fVar295 + fVar188 * fVar317;
    auVar372._0_8_ = CONCAT44(local_188,fVar357) & 0x7fffffff7fffffff;
    auVar372._8_4_ = ABS(fVar381);
    auVar372._12_4_ = ABS(fVar391);
    auVar265._0_8_ = CONCAT44(fVar378,fVar368) & 0x7fffffff7fffffff;
    auVar265._8_4_ = ABS(fVar390);
    auVar265._12_4_ = ABS(fVar413);
    auVar264 = maxps(auVar372,auVar265);
    auVar287._0_8_ = CONCAT44(local_428,fVar320) & 0x7fffffff7fffffff;
    auVar287._8_4_ = ABS(local_1d8);
    auVar287._12_4_ = ABS(fVar401);
    auVar204._0_8_ = CONCAT44(local_438,fVar221) & 0x7fffffff7fffffff;
    auVar204._8_4_ = ABS(fVar184);
    auVar204._12_4_ = ABS(fVar362);
    auVar190 = maxps(auVar287,auVar204);
    auVar190 = maxps(auVar264,auVar190);
    fStack_204 = auVar190._4_4_;
    uVar186 = auVar190._8_8_;
    fVar361 = fStack_204;
    if (fStack_204 <= auVar190._0_4_) {
      fVar361 = auVar190._0_4_;
    }
    auVar373._8_8_ = uVar186;
    auVar373._0_8_ = uVar186;
    if (auVar190._8_4_ <= fVar361) {
      auVar374._4_12_ = auVar373._4_12_;
      auVar374._0_4_ = fVar361;
      uVar186 = auVar374._0_8_;
    }
    local_208 = (float)iVar257;
    fStack_200 = fStack_204;
    fStack_1fc = fStack_204;
    local_3c8._4_4_ = -(uint)(1.0 < local_208);
    local_3c8._0_4_ = -(uint)(0.0 < local_208);
    iStack_3c0 = -(uint)(2.0 < local_208);
    iStack_3bc = -(uint)(3.0 < local_208);
    lVar115 = (long)iVar257;
    lVar114 = lVar115 * 0x44;
    local_408._4_4_ = fVar320;
    local_408._0_4_ = fVar320;
    fStack_400 = fVar320;
    fStack_3fc = fVar320;
    pauVar8 = (undefined1 (*) [16])(bezier_basis0 + lVar114 + 0xd8c);
    fVar361 = *(float *)*pauVar8;
    fVar188 = *(float *)(bezier_basis0 + lVar114 + 0xd90);
    fVar223 = *(float *)(bezier_basis0 + lVar114 + 0xd94);
    auVar71 = *(undefined1 (*) [12])*pauVar8;
    fVar275 = *(float *)(bezier_basis0 + lVar114 + 0xd98);
    _local_368 = *pauVar8;
    local_418 = CONCAT44(fVar221,fVar221);
    fStack_410 = fVar221;
    fStack_40c = fVar221;
    fVar279 = *(float *)*(undefined1 (*) [12])(bezier_basis0 + lVar114 + 0x908);
    fVar316 = *(float *)(bezier_basis0 + lVar114 + 0x90c);
    fVar295 = *(float *)(bezier_basis0 + lVar114 + 0x910);
    auVar74 = *(undefined1 (*) [12])(bezier_basis0 + lVar114 + 0x908);
    fVar297 = *(float *)(bezier_basis0 + lVar114 + 0x914);
    pauVar8 = (undefined1 (*) [16])(bezier_basis0 + lVar114 + 0x484);
    fVar350 = *(float *)*pauVar8;
    fVar317 = *(float *)(bezier_basis0 + lVar114 + 0x488);
    fVar324 = *(float *)(bezier_basis0 + lVar114 + 0x48c);
    auVar76 = *(undefined1 (*) [12])*pauVar8;
    fVar334 = *(float *)(bezier_basis0 + lVar114 + 0x490);
    _local_388 = *pauVar8;
    fVar341 = *(float *)(bezier_basis0 + lVar114);
    fVar336 = *(float *)(bezier_basis0 + lVar114 + 4);
    fVar337 = *(float *)(bezier_basis0 + lVar114 + 8);
    fVar338 = *(float *)(bezier_basis0 + lVar114 + 0xc);
    local_198 = fVar357 * fVar341 + fVar368 * fVar350 + fVar320 * fVar279 + fVar221 * fVar361;
    fStack_194 = fVar357 * fVar336 + fVar368 * fVar317 + fVar320 * fVar316 + fVar221 * fVar188;
    fStack_190 = fVar357 * fVar337 + fVar368 * fVar324 + fVar320 * fVar295 + fVar221 * fVar223;
    fStack_18c = fVar357 * fVar338 + fVar368 * fVar334 + fVar320 * fVar297 + fVar221 * fVar275;
    local_358 = local_188 * fVar341 + fVar378 * fVar350 + local_428 * fVar279 + local_438 * fVar361;
    fStack_354 = local_188 * fVar336 + fVar378 * fVar317 + local_428 * fVar316 + local_438 * fVar188
    ;
    fStack_350 = local_188 * fVar337 + fVar378 * fVar324 + local_428 * fVar295 + local_438 * fVar223
    ;
    fStack_34c = local_188 * fVar338 + fVar378 * fVar334 + local_428 * fVar297 + local_438 * fVar275
    ;
    fVar300 = fVar391 * fVar341 + fVar413 * fVar350 + fVar401 * fVar279 + fVar362 * fVar361;
    fVar310 = fVar391 * fVar336 + fVar413 * fVar317 + fVar401 * fVar316 + fVar362 * fVar188;
    auVar304._0_8_ = CONCAT44(fVar310,fVar300);
    auVar304._8_4_ = fVar391 * fVar337 + fVar413 * fVar324 + fVar401 * fVar295 + fVar362 * fVar223;
    auVar304._12_4_ = fVar391 * fVar338 + fVar413 * fVar334 + fVar401 * fVar297 + fVar362 * fVar275;
    fVar361 = *(float *)*(undefined1 (*) [12])(bezier_basis1 + lVar114 + 0xd8c);
    fVar188 = *(float *)(bezier_basis1 + lVar114 + 0xd90);
    fVar223 = *(float *)(bezier_basis1 + lVar114 + 0xd94);
    auVar78 = *(undefined1 (*) [12])(bezier_basis1 + lVar114 + 0xd8c);
    fVar279 = *(float *)(bezier_basis1 + lVar114 + 0xd98);
    fVar316 = *(float *)(bezier_basis1 + lVar114 + 0x908);
    fVar295 = *(float *)(bezier_basis1 + lVar114 + 0x90c);
    fVar350 = *(float *)(bezier_basis1 + lVar114 + 0x910);
    fVar317 = *(float *)(bezier_basis1 + lVar114 + 0x914);
    fStack_434 = local_438;
    fStack_430 = local_438;
    fStack_42c = local_438;
    fStack_424 = local_428;
    fStack_420 = local_428;
    fStack_41c = local_428;
    fVar324 = *(float *)(bezier_basis1 + lVar114 + 0x484);
    fVar342 = *(float *)(bezier_basis1 + lVar114 + 0x488);
    fVar343 = *(float *)(bezier_basis1 + lVar114 + 0x48c);
    fVar369 = *(float *)(bezier_basis1 + lVar114 + 0x490);
    fVar379 = *(float *)(bezier_basis1 + lVar114);
    fVar405 = *(float *)(bezier_basis1 + lVar114 + 4);
    fVar410 = *(float *)(bezier_basis1 + lVar114 + 8);
    fVar382 = *(float *)(bezier_basis1 + lVar114 + 0xc);
    local_1f8._0_4_ = fVar357 * fVar379 + fVar368 * fVar324 + fVar320 * fVar316 + fVar221 * fVar361;
    local_1f8._4_4_ = fVar357 * fVar405 + fVar368 * fVar342 + fVar320 * fVar295 + fVar221 * fVar188;
    fStack_1f0 = fVar357 * fVar410 + fVar368 * fVar343 + fVar320 * fVar350 + fVar221 * fVar223;
    fStack_1ec = fVar357 * fVar382 + fVar368 * fVar369 + fVar320 * fVar317 + fVar221 * fVar279;
    fStack_184 = local_188;
    fStack_180 = local_188;
    fStack_17c = local_188;
    fVar312 = local_188 * fVar379 + fVar378 * fVar324 + local_428 * fVar316 + local_438 * fVar361;
    fVar318 = local_188 * fVar405 + fVar378 * fVar342 + local_428 * fVar295 + local_438 * fVar188;
    fStack_3d0 = local_188 * fVar410 + fVar378 * fVar343 + local_428 * fVar350 + local_438 * fVar223
    ;
    fStack_3cc = local_188 * fVar382 + fVar378 * fVar369 + local_428 * fVar317 + local_438 * fVar279
    ;
    auVar355._0_4_ = fVar391 * fVar379 + fVar413 * fVar324 + fVar401 * fVar316 + fVar362 * fVar361;
    auVar355._4_4_ = fVar391 * fVar405 + fVar413 * fVar342 + fVar401 * fVar295 + fVar362 * fVar188;
    auVar355._8_4_ = fVar391 * fVar410 + fVar413 * fVar343 + fVar401 * fVar350 + fVar362 * fVar223;
    auVar355._12_4_ = fVar391 * fVar382 + fVar413 * fVar369 + fVar401 * fVar317 + fVar362 * fVar279;
    fVar280 = (float)local_1f8._0_4_ - local_198;
    fVar296 = (float)local_1f8._4_4_ - fStack_194;
    fVar298 = fStack_1f0 - fStack_190;
    fVar299 = fStack_1ec - fStack_18c;
    local_3d8 = CONCAT44(fVar318,fVar312);
    fVar313 = fVar312 - local_358;
    fVar319 = fVar318 - fStack_354;
    fVar321 = fStack_3d0 - fStack_350;
    fVar322 = fStack_3cc - fStack_34c;
    fVar361 = local_358 * fVar280 - local_198 * fVar313;
    fVar188 = fStack_354 * fVar296 - fStack_194 * fVar319;
    fVar223 = fStack_350 * fVar298 - fStack_190 * fVar321;
    fVar414 = fStack_34c * fVar299 - fStack_18c * fVar322;
    auVar330._8_4_ = auVar304._8_4_;
    auVar330._0_8_ = auVar304._0_8_;
    auVar330._12_4_ = auVar304._12_4_;
    auVar190 = maxps(auVar330,auVar355);
    bVar28 = fVar361 * fVar361 <=
             auVar190._0_4_ * auVar190._0_4_ * (fVar280 * fVar280 + fVar313 * fVar313) &&
             0.0 < local_208;
    auVar407._0_4_ = -(uint)bVar28;
    bVar94 = fVar188 * fVar188 <=
             auVar190._4_4_ * auVar190._4_4_ * (fVar296 * fVar296 + fVar319 * fVar319) &&
             1.0 < local_208;
    auVar407._4_4_ = -(uint)bVar94;
    bVar27 = fVar223 * fVar223 <=
             auVar190._8_4_ * auVar190._8_4_ * (fVar298 * fVar298 + fVar321 * fVar321) &&
             2.0 < local_208;
    auVar407._8_4_ = -(uint)bVar27;
    bVar26 = fVar414 * fVar414 <=
             auVar190._12_4_ * auVar190._12_4_ * (fVar299 * fVar299 + fVar322 * fVar322) &&
             3.0 < local_208;
    auVar407._12_4_ = -(uint)bVar26;
    local_468 = (float)uVar186;
    local_468 = local_468 * 4.7683716e-07;
    uVar111 = SUB84(pre,0);
    iVar178 = movmskps(uVar111,auVar407);
    fStack_1e4 = local_1e8;
    fStack_1e0 = local_1e8;
    fStack_1dc = local_1e8;
    local_398 = CONCAT44(fVar390,fVar390);
    uStack_390 = CONCAT44(fVar390,fVar390);
    fStack_1d4 = local_1d8;
    fStack_1d0 = local_1d8;
    fStack_1cc = local_1d8;
    fVar361 = fVar221;
    fVar188 = fVar320;
    fVar223 = fVar320;
    fVar414 = fVar320;
    if (iVar178 != 0) {
      local_1b8 = fVar313;
      fStack_1b4 = fVar319;
      fStack_1b0 = fVar321;
      fStack_1ac = fVar322;
      local_478._0_4_ = auVar78._0_4_;
      stack0xfffffffffffffb8c = auVar78._4_4_;
      fStack_470 = auVar78._8_4_;
      fVar125 = (float)local_478._0_4_ * fVar184 + fVar316 * local_1d8 + fVar324 * fVar390 +
                fVar379 * fVar381;
      fVar182 = stack0xfffffffffffffb8c * fVar184 + fVar295 * local_1d8 + fVar342 * fVar390 +
                fVar405 * fVar381;
      fVar185 = fStack_470 * fVar184 + fVar350 * local_1d8 + fVar343 * fVar390 + fVar410 * fVar381;
      fVar187 = fVar279 * fVar184 + fVar317 * local_1d8 + fVar369 * fVar390 + fVar382 * fVar381;
      local_388._0_4_ = auVar76._0_4_;
      local_388._4_4_ = auVar76._4_4_;
      fStack_380 = auVar76._8_4_;
      local_278 = auVar74._0_4_;
      fStack_274 = auVar74._4_4_;
      fStack_270 = auVar74._8_4_;
      local_368._0_4_ = auVar71._0_4_;
      local_368._4_4_ = auVar71._4_4_;
      fStack_360 = auVar71._8_4_;
      fVar262 = (float)local_368._0_4_ * fVar184 + local_278 * local_1d8 +
                (float)local_388._0_4_ * fVar390 + fVar341 * fVar381;
      fVar276 = (float)local_368._4_4_ * fVar184 + fStack_274 * local_1d8 +
                (float)local_388._4_4_ * fVar390 + fVar336 * fVar381;
      fVar277 = fStack_360 * fVar184 + fStack_270 * local_1d8 + fStack_380 * fVar390 +
                fVar337 * fVar381;
      fVar278 = fVar275 * fVar184 + fVar297 * local_1d8 + fVar334 * fVar390 + fVar338 * fVar381;
      fVar275 = *(float *)(bezier_basis0 + lVar114 + 0x1210);
      fVar279 = *(float *)(bezier_basis0 + lVar114 + 0x1214);
      fVar316 = *(float *)(bezier_basis0 + lVar114 + 0x1218);
      fVar295 = *(float *)(bezier_basis0 + lVar114 + 0x121c);
      fVar297 = *(float *)(bezier_basis0 + lVar114 + 0x1694);
      fVar350 = *(float *)(bezier_basis0 + lVar114 + 0x1698);
      fVar317 = *(float *)(bezier_basis0 + lVar114 + 0x169c);
      fVar324 = *(float *)(bezier_basis0 + lVar114 + 0x16a0);
      fVar334 = *(float *)(bezier_basis0 + lVar114 + 0x1b18);
      fVar341 = *(float *)(bezier_basis0 + lVar114 + 0x1b1c);
      fVar336 = *(float *)(bezier_basis0 + lVar114 + 0x1b20);
      fVar337 = *(float *)(bezier_basis0 + lVar114 + 0x1b24);
      fVar338 = *(float *)(bezier_basis0 + lVar114 + 0x1f9c);
      fVar342 = *(float *)(bezier_basis0 + lVar114 + 0x1fa0);
      fVar343 = *(float *)(bezier_basis0 + lVar114 + 0x1fa4);
      fVar369 = *(float *)(bezier_basis0 + lVar114 + 0x1fa8);
      _local_368 = auVar355;
      _local_3c8 = auVar304;
      auVar69._4_4_ = fVar357;
      auVar69._0_4_ = fVar357;
      auVar69._8_4_ = fVar357;
      auVar69._12_4_ = fVar357;
      fVar352 = fVar357 * fVar275 + fVar368 * fVar297 + fVar320 * fVar334 + fVar221 * fVar338;
      fVar359 = fVar357 * fVar279 + fVar368 * fVar350 + fVar320 * fVar341 + fVar221 * fVar342;
      fVar363 = fVar357 * fVar316 + fVar368 * fVar317 + fVar320 * fVar336 + fVar221 * fVar343;
      fVar366 = fVar357 * fVar295 + fVar368 * fVar324 + fVar320 * fVar337 + fVar221 * fVar369;
      fVar404 = local_188 * fVar275 + fVar378 * fVar297 + local_428 * fVar334 + local_438 * fVar338;
      fVar409 = local_188 * fVar279 + fVar378 * fVar350 + local_428 * fVar341 + local_438 * fVar342;
      fVar412 = local_188 * fVar316 + fVar378 * fVar317 + local_428 * fVar336 + local_438 * fVar343;
      fVar415 = local_188 * fVar295 + fVar378 * fVar324 + local_428 * fVar337 + local_438 * fVar369;
      fVar379 = *(float *)(bezier_basis1 + lVar114 + 0x1210);
      fVar405 = *(float *)(bezier_basis1 + lVar114 + 0x1214);
      fVar410 = *(float *)(bezier_basis1 + lVar114 + 0x1218);
      fVar382 = *(float *)(bezier_basis1 + lVar114 + 0x121c);
      fVar344 = *(float *)(bezier_basis1 + lVar114 + 0x1b18);
      fVar347 = *(float *)(bezier_basis1 + lVar114 + 0x1b1c);
      fVar348 = *(float *)(bezier_basis1 + lVar114 + 0x1b20);
      fVar349 = *(float *)(bezier_basis1 + lVar114 + 0x1b24);
      fVar353 = *(float *)(bezier_basis1 + lVar114 + 0x1f9c);
      fVar360 = *(float *)(bezier_basis1 + lVar114 + 0x1fa0);
      fVar364 = *(float *)(bezier_basis1 + lVar114 + 0x1fa4);
      fVar367 = *(float *)(bezier_basis1 + lVar114 + 0x1fa8);
      fVar370 = *(float *)(bezier_basis1 + lVar114 + 0x1694);
      fVar380 = *(float *)(bezier_basis1 + lVar114 + 0x1698);
      fVar383 = *(float *)(bezier_basis1 + lVar114 + 0x169c);
      fVar384 = *(float *)(bezier_basis1 + lVar114 + 0x16a0);
      fVar392 = fVar357 * fVar379 + fVar368 * fVar370 + fVar320 * fVar344 + fVar221 * fVar353;
      fVar398 = fVar357 * fVar405 + fVar368 * fVar380 + fVar320 * fVar347 + fVar221 * fVar360;
      fVar400 = fVar357 * fVar410 + fVar368 * fVar383 + fVar320 * fVar348 + fVar221 * fVar364;
      fVar402 = fVar357 * fVar382 + fVar368 * fVar384 + fVar320 * fVar349 + fVar221 * fVar367;
      fVar189 = local_188 * fVar379 + fVar378 * fVar370 + local_428 * fVar344 + local_438 * fVar353;
      fVar222 = local_188 * fVar405 + fVar378 * fVar380 + local_428 * fVar347 + local_438 * fVar360;
      fVar224 = local_188 * fVar410 + fVar378 * fVar383 + local_428 * fVar348 + local_438 * fVar364;
      fVar225 = local_188 * fVar382 + fVar378 * fVar384 + local_428 * fVar349 + local_438 * fVar367;
      auVar375._0_8_ = CONCAT44(fVar359,fVar352) & 0x7fffffff7fffffff;
      auVar375._8_4_ = ABS(fVar363);
      auVar375._12_4_ = ABS(fVar366);
      auVar331._0_8_ = CONCAT44(fVar409,fVar404) & 0x7fffffff7fffffff;
      auVar331._8_4_ = ABS(fVar412);
      auVar331._12_4_ = ABS(fVar415);
      auVar190 = maxps(auVar375,auVar331);
      auVar386._0_8_ =
           CONCAT44(fVar279 * fVar381 + fVar350 * fVar390 + fVar341 * local_1d8 + fVar342 * fVar184,
                    fVar275 * fVar381 + fVar297 * fVar390 + fVar334 * local_1d8 + fVar338 * fVar184)
           & 0x7fffffff7fffffff;
      auVar386._8_4_ =
           ABS(fVar316 * fVar381 + fVar317 * fVar390 + fVar336 * local_1d8 + fVar343 * fVar184);
      auVar386._12_4_ =
           ABS(fVar295 * fVar381 + fVar324 * fVar390 + fVar337 * local_1d8 + fVar369 * fVar184);
      auVar190 = maxps(auVar190,auVar386);
      uVar117 = -(uint)(local_468 <= auVar190._0_4_);
      uVar118 = -(uint)(local_468 <= auVar190._4_4_);
      uVar119 = -(uint)(local_468 <= auVar190._8_4_);
      uVar120 = -(uint)(local_468 <= auVar190._12_4_);
      fVar350 = (float)((uint)fVar352 & uVar117 | ~uVar117 & (uint)fVar280);
      fVar324 = (float)((uint)fVar359 & uVar118 | ~uVar118 & (uint)fVar296);
      fVar334 = (float)((uint)fVar363 & uVar119 | ~uVar119 & (uint)fVar298);
      fVar341 = (float)((uint)fVar366 & uVar120 | ~uVar120 & (uint)fVar299);
      fVar336 = (float)(~uVar117 & (uint)fVar313 | (uint)fVar404 & uVar117);
      fVar337 = (float)(~uVar118 & (uint)fVar319 | (uint)fVar409 & uVar118);
      fVar338 = (float)(~uVar119 & (uint)fVar321 | (uint)fVar412 & uVar119);
      fVar342 = (float)(~uVar120 & (uint)fVar322 | (uint)fVar415 & uVar120);
      auVar387._0_8_ = CONCAT44(fVar398,fVar392) & 0x7fffffff7fffffff;
      auVar387._8_4_ = ABS(fVar400);
      auVar387._12_4_ = ABS(fVar402);
      auVar340._0_8_ = CONCAT44(fVar222,fVar189) & 0x7fffffff7fffffff;
      auVar340._8_4_ = ABS(fVar224);
      auVar340._12_4_ = ABS(fVar225);
      auVar190 = maxps(auVar387,auVar340);
      auVar314._0_8_ =
           CONCAT44(fVar405 * fVar381 + fVar380 * fVar390 + fVar347 * local_1d8 + fVar360 * fVar184,
                    fVar379 * fVar381 + fVar370 * fVar390 + fVar344 * local_1d8 + fVar353 * fVar184)
           & 0x7fffffff7fffffff;
      auVar314._8_4_ =
           ABS(fVar410 * fVar381 + fVar383 * fVar390 + fVar348 * local_1d8 + fVar364 * fVar184);
      auVar314._12_4_ =
           ABS(fVar382 * fVar381 + fVar384 * fVar390 + fVar349 * local_1d8 + fVar367 * fVar184);
      auVar190 = maxps(auVar190,auVar314);
      uVar117 = -(uint)(local_468 <= auVar190._0_4_);
      uVar118 = -(uint)(local_468 <= auVar190._4_4_);
      uVar119 = -(uint)(local_468 <= auVar190._8_4_);
      uVar120 = -(uint)(local_468 <= auVar190._12_4_);
      fVar353 = (float)((uint)fVar392 & uVar117 | ~uVar117 & (uint)fVar280);
      fVar360 = (float)((uint)fVar398 & uVar118 | ~uVar118 & (uint)fVar296);
      fVar364 = (float)((uint)fVar400 & uVar119 | ~uVar119 & (uint)fVar298);
      fVar299 = (float)((uint)fVar402 & uVar120 | ~uVar120 & (uint)fVar299);
      fVar390 = (float)(~uVar117 & (uint)fVar313 | (uint)fVar189 & uVar117);
      fVar343 = (float)(~uVar118 & (uint)fVar319 | (uint)fVar222 & uVar118);
      fVar296 = (float)(~uVar119 & (uint)fVar321 | (uint)fVar224 & uVar119);
      fVar298 = (float)(~uVar120 & (uint)fVar322 | (uint)fVar225 & uVar120);
      auVar205._0_4_ = fVar336 * fVar336 + fVar350 * fVar350;
      auVar205._4_4_ = fVar337 * fVar337 + fVar324 * fVar324;
      auVar205._8_4_ = fVar338 * fVar338 + fVar334 * fVar334;
      auVar205._12_4_ = fVar342 * fVar342 + fVar341 * fVar341;
      auVar190 = rsqrtps(auVar69,auVar205);
      fVar275 = auVar190._0_4_;
      fVar279 = auVar190._4_4_;
      fVar316 = auVar190._8_4_;
      fVar295 = auVar190._12_4_;
      auVar288._0_4_ = fVar275 * fVar275 * auVar205._0_4_ * 0.5 * fVar275;
      auVar288._4_4_ = fVar279 * fVar279 * auVar205._4_4_ * 0.5 * fVar279;
      auVar288._8_4_ = fVar316 * fVar316 * auVar205._8_4_ * 0.5 * fVar316;
      auVar288._12_4_ = fVar295 * fVar295 * auVar205._12_4_ * 0.5 * fVar295;
      fVar405 = fVar275 * 1.5 - auVar288._0_4_;
      fVar410 = fVar279 * 1.5 - auVar288._4_4_;
      fVar313 = fVar316 * 1.5 - auVar288._8_4_;
      fVar319 = fVar295 * 1.5 - auVar288._12_4_;
      auVar206._0_4_ = fVar390 * fVar390 + fVar353 * fVar353;
      auVar206._4_4_ = fVar343 * fVar343 + fVar360 * fVar360;
      auVar206._8_4_ = fVar296 * fVar296 + fVar364 * fVar364;
      auVar206._12_4_ = fVar298 * fVar298 + fVar299 * fVar299;
      auVar190 = rsqrtps(auVar288,auVar206);
      fVar275 = auVar190._0_4_;
      fVar279 = auVar190._4_4_;
      fVar316 = auVar190._8_4_;
      fVar295 = auVar190._12_4_;
      fVar275 = fVar275 * 1.5 - fVar275 * fVar275 * auVar206._0_4_ * 0.5 * fVar275;
      fVar297 = fVar279 * 1.5 - fVar279 * fVar279 * auVar206._4_4_ * 0.5 * fVar279;
      fVar316 = fVar316 * 1.5 - fVar316 * fVar316 * auVar206._8_4_ * 0.5 * fVar316;
      fVar317 = fVar295 * 1.5 - fVar295 * fVar295 * auVar206._12_4_ * 0.5 * fVar295;
      fVar369 = fVar336 * fVar405 * fVar300;
      fVar379 = fVar337 * fVar410 * fVar310;
      fVar382 = fVar338 * fVar313 * auVar304._8_4_;
      fVar280 = fVar342 * fVar319 * auVar304._12_4_;
      fVar279 = -fVar350 * fVar405 * fVar300;
      fVar295 = -fVar324 * fVar410 * fVar310;
      fVar350 = -fVar334 * fVar313 * auVar304._8_4_;
      fVar324 = -fVar341 * fVar319 * auVar304._12_4_;
      fVar322 = fVar405 * 0.0 * fVar300;
      fVar189 = fVar410 * 0.0 * fVar310;
      fVar222 = fVar313 * 0.0 * auVar304._8_4_;
      fVar224 = fVar319 * 0.0 * auVar304._12_4_;
      local_388._0_4_ = fVar262 + fVar322;
      local_388._4_4_ = fVar276 + fVar189;
      fStack_380 = fVar277 + fVar222;
      fStack_37c = fVar278 + fVar224;
      fVar405 = fVar390 * fVar275 * auVar355._0_4_;
      fVar410 = fVar343 * fVar297 * auVar355._4_4_;
      fVar313 = fVar296 * fVar316 * auVar355._8_4_;
      fVar319 = fVar298 * fVar317 * auVar355._12_4_;
      fVar344 = (float)local_1f8._0_4_ + fVar405;
      fVar347 = (float)local_1f8._4_4_ + fVar410;
      fVar348 = fStack_1f0 + fVar313;
      fVar349 = fStack_1ec + fVar319;
      fVar334 = -fVar353 * fVar275 * auVar355._0_4_;
      fVar341 = -fVar360 * fVar297 * auVar355._4_4_;
      fVar342 = -fVar364 * fVar316 * auVar355._8_4_;
      fVar343 = -fVar299 * fVar317 * auVar355._12_4_;
      fVar353 = fVar312 + fVar334;
      fVar360 = fVar318 + fVar341;
      fVar364 = fStack_3d0 + fVar342;
      fVar367 = fStack_3cc + fVar343;
      fVar390 = fVar275 * 0.0 * auVar355._0_4_;
      fVar336 = fVar297 * 0.0 * auVar355._4_4_;
      fVar337 = fVar316 * 0.0 * auVar355._8_4_;
      fVar338 = fVar317 * 0.0 * auVar355._12_4_;
      fVar296 = local_198 - fVar369;
      fVar298 = fStack_194 - fVar379;
      fVar299 = fStack_190 - fVar382;
      fVar321 = fStack_18c - fVar280;
      fVar370 = fVar125 + fVar390;
      fVar380 = fVar182 + fVar336;
      fVar383 = fVar185 + fVar337;
      fVar384 = fVar187 + fVar338;
      fVar275 = local_358 - fVar279;
      fVar316 = fStack_354 - fVar295;
      fVar297 = fStack_350 - fVar350;
      fVar317 = fStack_34c - fVar324;
      fVar262 = fVar262 - fVar322;
      fVar276 = fVar276 - fVar189;
      fVar277 = fVar277 - fVar222;
      fVar278 = fVar278 - fVar224;
      uVar117 = -(uint)(0.0 < (fVar275 * (fVar370 - fVar262) - fVar262 * (fVar353 - fVar275)) * 0.0
                              + (fVar262 * (fVar344 - fVar296) - (fVar370 - fVar262) * fVar296) *
                                0.0 + ((fVar353 - fVar275) * fVar296 - (fVar344 - fVar296) * fVar275
                                      ));
      uVar118 = -(uint)(0.0 < (fVar316 * (fVar380 - fVar276) - fVar276 * (fVar360 - fVar316)) * 0.0
                              + (fVar276 * (fVar347 - fVar298) - (fVar380 - fVar276) * fVar298) *
                                0.0 + ((fVar360 - fVar316) * fVar298 - (fVar347 - fVar298) * fVar316
                                      ));
      uVar119 = -(uint)(0.0 < (fVar297 * (fVar383 - fVar277) - fVar277 * (fVar364 - fVar297)) * 0.0
                              + (fVar277 * (fVar348 - fVar299) - (fVar383 - fVar277) * fVar299) *
                                0.0 + ((fVar364 - fVar297) * fVar299 - (fVar348 - fVar299) * fVar297
                                      ));
      uVar120 = -(uint)(0.0 < (fVar317 * (fVar384 - fVar278) - fVar278 * (fVar367 - fVar317)) * 0.0
                              + (fVar278 * (fVar349 - fVar321) - (fVar384 - fVar278) * fVar321) *
                                0.0 + ((fVar367 - fVar317) * fVar321 - (fVar349 - fVar321) * fVar317
                                      ));
      fVar405 = (float)((uint)((float)local_1f8._0_4_ - fVar405) & uVar117 |
                       ~uVar117 & (uint)(local_198 + fVar369));
      fVar410 = (float)((uint)((float)local_1f8._4_4_ - fVar410) & uVar118 |
                       ~uVar118 & (uint)(fStack_194 + fVar379));
      fVar382 = (float)((uint)(fStack_1f0 - fVar313) & uVar119 |
                       ~uVar119 & (uint)(fStack_190 + fVar382));
      fVar280 = (float)((uint)(fStack_1ec - fVar319) & uVar120 |
                       ~uVar120 & (uint)(fStack_18c + fVar280));
      fVar334 = (float)((uint)(fVar312 - fVar334) & uVar117 | ~uVar117 & (uint)(local_358 + fVar279)
                       );
      fVar341 = (float)((uint)(fVar318 - fVar341) & uVar118 |
                       ~uVar118 & (uint)(fStack_354 + fVar295));
      fStack_3d0 = (float)((uint)(fStack_3d0 - fVar342) & uVar119 |
                          ~uVar119 & (uint)(fStack_350 + fVar350));
      fStack_3cc = (float)((uint)(fStack_3cc - fVar343) & uVar120 |
                          ~uVar120 & (uint)(fStack_34c + fVar324));
      fVar342 = (float)((uint)(fVar125 - fVar390) & uVar117 | ~uVar117 & local_388._0_4_);
      fVar343 = (float)((uint)(fVar182 - fVar336) & uVar118 | ~uVar118 & local_388._4_4_);
      fVar369 = (float)((uint)(fVar185 - fVar337) & uVar119 | ~uVar119 & (uint)fStack_380);
      fVar379 = (float)((uint)(fVar187 - fVar338) & uVar120 | ~uVar120 & (uint)fStack_37c);
      fVar313 = (float)((uint)fVar296 & uVar117 | ~uVar117 & (uint)fVar344);
      fVar318 = (float)((uint)fVar298 & uVar118 | ~uVar118 & (uint)fVar347);
      fVar319 = (float)((uint)fVar299 & uVar119 | ~uVar119 & (uint)fVar348);
      fVar322 = (float)((uint)fVar321 & uVar120 | ~uVar120 & (uint)fVar349);
      fVar279 = (float)((uint)fVar275 & uVar117 | ~uVar117 & (uint)fVar353);
      fVar295 = (float)((uint)fVar316 & uVar118 | ~uVar118 & (uint)fVar360);
      fVar350 = (float)((uint)fVar297 & uVar119 | ~uVar119 & (uint)fVar364);
      fVar324 = (float)((uint)fVar317 & uVar120 | ~uVar120 & (uint)fVar367);
      fVar390 = (float)((uint)fVar262 & uVar117 | ~uVar117 & (uint)fVar370);
      fVar336 = (float)((uint)fVar276 & uVar118 | ~uVar118 & (uint)fVar380);
      fVar337 = (float)((uint)fVar277 & uVar119 | ~uVar119 & (uint)fVar383);
      fVar338 = (float)((uint)fVar278 & uVar120 | ~uVar120 & (uint)fVar384);
      fVar344 = (float)((uint)fVar344 & uVar117 | ~uVar117 & (uint)fVar296) - fVar405;
      fVar347 = (float)((uint)fVar347 & uVar118 | ~uVar118 & (uint)fVar298) - fVar410;
      fVar348 = (float)((uint)fVar348 & uVar119 | ~uVar119 & (uint)fVar299) - fVar382;
      fVar321 = (float)((uint)fVar349 & uVar120 | ~uVar120 & (uint)fVar321) - fVar280;
      fVar349 = (float)((uint)fVar353 & uVar117 | ~uVar117 & (uint)fVar275) - fVar334;
      fVar353 = (float)((uint)fVar360 & uVar118 | ~uVar118 & (uint)fVar316) - fVar341;
      fVar360 = (float)((uint)fVar364 & uVar119 | ~uVar119 & (uint)fVar297) - fStack_3d0;
      fVar364 = (float)((uint)fVar367 & uVar120 | ~uVar120 & (uint)fVar317) - fStack_3cc;
      fVar367 = (float)((uint)fVar370 & uVar117 | ~uVar117 & (uint)fVar262) - fVar342;
      fVar370 = (float)((uint)fVar380 & uVar118 | ~uVar118 & (uint)fVar276) - fVar343;
      fVar380 = (float)((uint)fVar383 & uVar119 | ~uVar119 & (uint)fVar277) - fVar369;
      fVar383 = (float)((uint)fVar384 & uVar120 | ~uVar120 & (uint)fVar278) - fVar379;
      fVar187 = fVar405 - fVar313;
      fVar189 = fVar410 - fVar318;
      fVar222 = fVar382 - fVar319;
      fVar224 = fVar280 - fVar322;
      fVar296 = fVar334 - fVar279;
      fVar298 = fVar341 - fVar295;
      fVar299 = fStack_3d0 - fVar350;
      fVar312 = fStack_3cc - fVar324;
      local_3d8 = CONCAT44(fVar341,fVar334);
      fVar275 = fVar342 - fVar390;
      fVar316 = fVar343 - fVar336;
      fVar297 = fVar369 - fVar337;
      fVar317 = fVar379 - fVar338;
      fVar384 = (fVar334 * fVar367 - fVar342 * fVar349) * 0.0 +
                (fVar342 * fVar344 - fVar405 * fVar367) * 0.0 +
                (fVar405 * fVar349 - fVar334 * fVar344);
      fVar125 = (fVar341 * fVar370 - fVar343 * fVar353) * 0.0 +
                (fVar343 * fVar347 - fVar410 * fVar370) * 0.0 +
                (fVar410 * fVar353 - fVar341 * fVar347);
      auVar266._4_4_ = fVar125;
      auVar266._0_4_ = fVar384;
      fVar182 = (fStack_3d0 * fVar380 - fVar369 * fVar360) * 0.0 +
                (fVar369 * fVar348 - fVar382 * fVar380) * 0.0 +
                (fVar382 * fVar360 - fStack_3d0 * fVar348);
      fVar185 = (fStack_3cc * fVar383 - fVar379 * fVar364) * 0.0 +
                (fVar379 * fVar321 - fVar280 * fVar383) * 0.0 +
                (fVar280 * fVar364 - fStack_3cc * fVar321);
      auVar394._0_4_ =
           (fVar279 * fVar275 - fVar390 * fVar296) * 0.0 +
           (fVar390 * fVar187 - fVar313 * fVar275) * 0.0 + (fVar313 * fVar296 - fVar279 * fVar187);
      auVar394._4_4_ =
           (fVar295 * fVar316 - fVar336 * fVar298) * 0.0 +
           (fVar336 * fVar189 - fVar318 * fVar316) * 0.0 + (fVar318 * fVar298 - fVar295 * fVar189);
      auVar394._8_4_ =
           (fVar350 * fVar297 - fVar337 * fVar299) * 0.0 +
           (fVar337 * fVar222 - fVar319 * fVar297) * 0.0 + (fVar319 * fVar299 - fVar350 * fVar222);
      auVar394._12_4_ =
           (fVar324 * fVar317 - fVar338 * fVar312) * 0.0 +
           (fVar338 * fVar224 - fVar322 * fVar317) * 0.0 + (fVar322 * fVar312 - fVar324 * fVar224);
      auVar266._8_4_ = fVar182;
      auVar266._12_4_ = fVar185;
      auVar190 = maxps(auVar266,auVar394);
      bVar28 = auVar190._0_4_ <= 0.0 && bVar28;
      auVar267._0_4_ = -(uint)bVar28;
      bVar94 = auVar190._4_4_ <= 0.0 && bVar94;
      auVar267._4_4_ = -(uint)bVar94;
      bVar27 = auVar190._8_4_ <= 0.0 && bVar27;
      auVar267._8_4_ = -(uint)bVar27;
      bVar26 = auVar190._12_4_ <= 0.0 && bVar26;
      auVar267._12_4_ = -(uint)bVar26;
      iVar178 = movmskps(iVar178,auVar267);
      aVar333 = local_3f8;
      aVar346 = local_3e8;
      if (iVar178 == 0) {
LAB_003618e6:
        auVar268._8_8_ = uVar104;
        auVar268._0_8_ = uVar103;
      }
      else {
        fVar279 = (ray->super_RayK<1>).tfar;
        auVar289._0_4_ = fVar275 * fVar349;
        auVar289._4_4_ = fVar316 * fVar353;
        auVar289._8_4_ = fVar297 * fVar360;
        auVar289._12_4_ = fVar317 * fVar364;
        fVar336 = fVar296 * fVar367 - auVar289._0_4_;
        fVar337 = fVar298 * fVar370 - auVar289._4_4_;
        fVar338 = fVar299 * fVar380 - auVar289._8_4_;
        fVar313 = fVar312 * fVar383 - auVar289._12_4_;
        fVar275 = fVar275 * fVar344 - fVar367 * fVar187;
        fVar295 = fVar316 * fVar347 - fVar370 * fVar189;
        fVar350 = fVar297 * fVar348 - fVar380 * fVar222;
        fVar324 = fVar317 * fVar321 - fVar383 * fVar224;
        fVar296 = fVar187 * fVar349 - fVar296 * fVar344;
        fVar298 = fVar189 * fVar353 - fVar298 * fVar347;
        fVar299 = fVar222 * fVar360 - fVar299 * fVar348;
        fVar312 = fVar224 * fVar364 - fVar312 * fVar321;
        auVar305._0_4_ = fVar336 * 0.0 + fVar275 * 0.0 + fVar296;
        auVar305._4_4_ = fVar337 * 0.0 + fVar295 * 0.0 + fVar298;
        auVar305._8_4_ = fVar338 * 0.0 + fVar350 * 0.0 + fVar299;
        auVar305._12_4_ = fVar313 * 0.0 + fVar324 * 0.0 + fVar312;
        auVar190 = rcpps(auVar289,auVar305);
        fVar316 = auVar190._0_4_;
        fVar297 = auVar190._4_4_;
        fVar317 = auVar190._8_4_;
        fVar390 = auVar190._12_4_;
        fVar316 = (1.0 - auVar305._0_4_ * fVar316) * fVar316 + fVar316;
        fVar297 = (1.0 - auVar305._4_4_ * fVar297) * fVar297 + fVar297;
        fVar317 = (1.0 - auVar305._8_4_ * fVar317) * fVar317 + fVar317;
        fVar390 = (1.0 - auVar305._12_4_ * fVar390) * fVar390 + fVar390;
        fVar275 = (fVar342 * fVar296 + fVar334 * fVar275 + fVar405 * fVar336) * fVar316;
        fVar295 = (fVar343 * fVar298 + fVar341 * fVar295 + fVar410 * fVar337) * fVar297;
        aVar332.v[1] = fVar295;
        aVar332.v[0] = fVar275;
        fVar350 = (fVar369 * fVar299 + fStack_3d0 * fVar350 + fVar382 * fVar338) * fVar317;
        fVar324 = (fVar379 * fVar312 + fStack_3cc * fVar324 + fVar280 * fVar313) * fVar390;
        bVar28 = (fVar275 <= fVar279 && local_1e8 <= fVar275) && bVar28;
        auVar170._0_4_ = -(uint)bVar28;
        bVar94 = (fVar295 <= fVar279 && local_1e8 <= fVar295) && bVar94;
        auVar170._4_4_ = -(uint)bVar94;
        bVar27 = (fVar350 <= fVar279 && local_1e8 <= fVar350) && bVar27;
        auVar170._8_4_ = -(uint)bVar27;
        bVar26 = (fVar324 <= fVar279 && local_1e8 <= fVar324) && bVar26;
        auVar170._12_4_ = -(uint)bVar26;
        iVar178 = movmskps(iVar178,auVar170);
        if (iVar178 == 0) goto LAB_003618e6;
        auVar171._0_8_ =
             CONCAT44(-(uint)(auVar305._4_4_ != 0.0 && bVar94),
                      -(uint)(auVar305._0_4_ != 0.0 && bVar28));
        auVar171._8_4_ = -(uint)(auVar305._8_4_ != 0.0 && bVar27);
        auVar171._12_4_ = -(uint)(auVar305._12_4_ != 0.0 && bVar26);
        iVar178 = movmskps(iVar178,auVar171);
        auVar268._8_8_ = uVar104;
        auVar268._0_8_ = uVar103;
        if (iVar178 != 0) {
          fVar384 = fVar384 * fVar316;
          fVar125 = fVar125 * fVar297;
          fVar182 = fVar182 * fVar317;
          fVar185 = fVar185 * fVar390;
          auVar207._0_4_ = ~uVar117 & (uint)fVar384;
          auVar207._4_4_ = ~uVar118 & (uint)fVar125;
          auVar207._8_4_ = ~uVar119 & (uint)fVar182;
          auVar207._12_4_ = ~uVar120 & (uint)fVar185;
          auVar345._0_4_ = (uint)(1.0 - fVar384) & uVar117;
          auVar345._4_4_ = (uint)(1.0 - fVar125) & uVar118;
          auVar345._8_4_ = (uint)(1.0 - fVar182) & uVar119;
          auVar345._12_4_ = (uint)(1.0 - fVar185) & uVar120;
          auVar268._8_4_ = auVar171._8_4_;
          auVar268._0_8_ = auVar171._0_8_;
          auVar268._12_4_ = auVar171._12_4_;
          aVar332.v[2] = fVar350;
          aVar332.v[3] = fVar324;
          local_1a8 = (float)(~uVar117 & (uint)(auVar394._0_4_ * fVar316) |
                             (uint)(1.0 - auVar394._0_4_ * fVar316) & uVar117);
          fStack_1a4 = (float)(~uVar118 & (uint)(auVar394._4_4_ * fVar297) |
                              (uint)(1.0 - auVar394._4_4_ * fVar297) & uVar118);
          fStack_1a0 = (float)(~uVar119 & (uint)(auVar394._8_4_ * fVar317) |
                              (uint)(1.0 - auVar394._8_4_ * fVar317) & uVar119);
          fStack_19c = (float)(~uVar120 & (uint)(auVar394._12_4_ * fVar390) |
                              (uint)(1.0 - auVar394._12_4_ * fVar390) & uVar120);
          aVar333 = aVar332;
          aVar346 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)(auVar345 | auVar207);
        }
      }
      iVar178 = movmskps(iVar178,auVar268);
      if (iVar178 == 0) {
LAB_003618a8:
        local_3f8 = aVar333;
        local_3e8 = aVar346;
        fVar221 = (float)local_418;
        fVar361 = local_418._4_4_;
      }
      else {
        fVar300 = (auVar355._0_4_ - fVar300) * aVar346.v[0] + fVar300;
        fVar310 = (auVar355._4_4_ - fVar310) * aVar346.v[1] + fVar310;
        fVar279 = (auVar355._8_4_ - auVar304._8_4_) * aVar346.v[2] + auVar304._8_4_;
        fVar316 = (auVar355._12_4_ - auVar304._12_4_) * aVar346.v[3] + auVar304._12_4_;
        fVar275 = pre->depth_scale;
        aVar172._0_4_ = -(uint)(fVar275 * (fVar300 + fVar300) < aVar333.v[0]) & auVar268._0_4_;
        aVar172._4_4_ = -(uint)(fVar275 * (fVar310 + fVar310) < aVar333.v[1]) & auVar268._4_4_;
        aVar172.i[2] = -(uint)(fVar275 * (fVar279 + fVar279) < aVar333.v[2]) & auVar268._8_4_;
        aVar172.i[3] = -(uint)(fVar275 * (fVar316 + fVar316) < aVar333.v[3]) & auVar268._12_4_;
        iVar178 = movmskps(uVar111,(undefined1  [16])aVar172);
        local_3f8 = aVar333;
        local_3e8 = aVar346;
        if (iVar178 != 0) {
          local_1a8 = local_1a8 + local_1a8 + -1.0;
          fStack_1a4 = fStack_1a4 + fStack_1a4 + -1.0;
          fStack_1a0 = fStack_1a0 + fStack_1a0 + -1.0;
          fStack_19c = fStack_19c + fStack_19c + -1.0;
          bhit.U.field_0 = aVar346;
          bhit.V.field_0.v[0] = local_1a8;
          bhit.V.field_0.v[1] = fStack_1a4;
          bhit.V.field_0.v[2] = fStack_1a0;
          bhit.V.field_0.v[3] = fStack_19c;
          bhit.T.field_0 = aVar333;
          bhit.i = 0;
          bhit.N = iVar257;
          bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fVar260,fVar258);
          bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fVar391,fVar261);
          bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fVar408,fVar403);
          bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fVar413,fVar411);
          bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fVar397,fVar365);
          bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fVar401,fVar399);
          bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fVar351,fVar335);
          bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fVar362,fVar358);
          bhit.valid.field_0 = aVar172;
          uVar117 = (ray->super_RayK<1>).mask;
          if ((pGVar24->mask & uVar117) != 0) {
            valid.field_0 = aVar172;
            fVar361 = 1.0 / local_208;
            bhit.vu.field_0.v[0] = fVar361 * (aVar346.v[0] + 0.0);
            bhit.vu.field_0.v[1] = fVar361 * (aVar346.v[1] + 1.0);
            bhit.vu.field_0.v[2] = fVar361 * (aVar346.v[2] + 2.0);
            bhit.vu.field_0.v[3] = fVar361 * (aVar346.v[3] + 3.0);
            bhit.vv.field_0._0_8_ = CONCAT44(fStack_1a4,local_1a8);
            bhit.vv.field_0._8_8_ = CONCAT44(fStack_19c,fStack_1a0);
            bhit.vt.field_0 = aVar333;
            auVar208._0_4_ = aVar172._0_4_ & (uint)aVar333.v[0];
            auVar208._4_4_ = aVar172._4_4_ & (uint)aVar333.v[1];
            auVar208._8_4_ = aVar172.i[2] & (uint)aVar333.v[2];
            auVar208._12_4_ = aVar172.i[3] & (uint)aVar333.v[3];
            auVar248._0_8_ = CONCAT44(~aVar172._4_4_,~aVar172._0_4_) & 0x7f8000007f800000;
            auVar248._8_4_ = ~aVar172.i[2] & 0x7f800000;
            auVar248._12_4_ = ~aVar172.i[3] & 0x7f800000;
            auVar248 = auVar248 | auVar208;
            auVar269._4_4_ = auVar248._0_4_;
            auVar269._0_4_ = auVar248._4_4_;
            auVar269._8_4_ = auVar248._12_4_;
            auVar269._12_4_ = auVar248._8_4_;
            auVar190 = minps(auVar269,auVar248);
            auVar209._0_8_ = auVar190._8_8_;
            auVar209._8_4_ = auVar190._0_4_;
            auVar209._12_4_ = auVar190._4_4_;
            auVar190 = minps(auVar209,auVar190);
            auVar210._0_8_ =
                 CONCAT44(-(uint)(auVar190._4_4_ == auVar248._4_4_) & aVar172._4_4_,
                          -(uint)(auVar190._0_4_ == auVar248._0_4_) & aVar172._0_4_);
            auVar210._8_4_ = -(uint)(auVar190._8_4_ == auVar248._8_4_) & aVar172.i[2];
            auVar210._12_4_ = -(uint)(auVar190._12_4_ == auVar248._12_4_) & aVar172.i[3];
            iVar178 = movmskps(uVar117,auVar210);
            if (iVar178 != 0) {
              aVar172.i[2] = auVar210._8_4_;
              aVar172._0_8_ = auVar210._0_8_;
              aVar172.i[3] = auVar210._12_4_;
            }
            uVar117 = movmskps(iVar178,(undefined1  [16])aVar172);
            lVar113 = 0;
            if (uVar117 != 0) {
              for (; (uVar117 >> lVar113 & 1) == 0; lVar113 = lVar113 + 1) {
              }
            }
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar24->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar361 = bhit.vu.field_0.v[lVar113];
              fVar221 = bhit.vv.field_0.v[lVar113];
              fVar275 = 1.0 - fVar361;
              fVar316 = fVar361 * fVar275 + fVar361 * fVar275;
              fVar279 = fVar275 * fVar275 * -3.0;
              fVar295 = (fVar275 * fVar275 - fVar316) * 3.0;
              fVar275 = (fVar316 - fVar361 * fVar361) * 3.0;
              fVar316 = fVar361 * fVar361 * 3.0;
              (ray->super_RayK<1>).tfar = bhit.vt.field_0.v[lVar113];
              *(ulong *)&(ray->Ng).field_0 =
                   CONCAT44(fVar279 * fVar260 +
                            fVar295 * fVar408 + fVar275 * fVar397 + fVar316 * fVar351,
                            fVar279 * fVar258 +
                            fVar295 * fVar403 + fVar275 * fVar365 + fVar316 * fVar335);
              (ray->Ng).field_0.field_0.z =
                   fVar279 * fVar261 + fVar295 * fVar411 + fVar275 * fVar399 + fVar316 * fVar358;
              ray->u = fVar361;
              ray->v = fVar221;
              ray->primID = (uint)local_370;
              ray->geomID = (uint)local_3b0;
              ray->instID[0] = context->user->instID[0];
              ray->instPrimID[0] = context->user->instPrimID[0];
              pRVar109 = (RTCIntersectArguments *)context;
            }
            else {
              _local_478 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
LAB_00362929:
              local_23c = bhit.vu.field_0.v[lVar113];
              local_238 = bhit.vv.field_0.v[lVar113];
              (ray->super_RayK<1>).tfar = bhit.vt.field_0.v[lVar113];
              args.context = context->user;
              fVar361 = 1.0 - local_23c;
              fVar275 = local_23c * fVar361 + local_23c * fVar361;
              fVar221 = fVar361 * fVar361 * -3.0;
              fVar279 = (fVar361 * fVar361 - fVar275) * 3.0;
              fVar361 = (fVar275 - local_23c * local_23c) * 3.0;
              fVar275 = local_23c * local_23c * 3.0;
              local_248 = CONCAT44(fVar221 * fVar260 +
                                   fVar279 * fVar408 + fVar361 * fVar397 + fVar275 * fVar351,
                                   fVar221 * fVar258 +
                                   fVar279 * fVar403 + fVar361 * fVar365 + fVar275 * fVar335);
              local_240 = fVar221 * fVar261 +
                          fVar279 * fVar411 + fVar361 * fVar399 + fVar275 * fVar358;
              local_234 = (int)local_370;
              local_230 = (int)local_3b0;
              local_22c = (args.context)->instID[0];
              local_228 = (args.context)->instPrimID[0];
              local_43c = -1;
              args.valid = &local_43c;
              pRVar109 = (RTCIntersectArguments *)pGVar24->userPtr;
              args.geometryUserPtr = pRVar109;
              args.ray = (RTCRayN *)ray;
              args.hit = (RTCHitN *)&local_248;
              args.N = 1;
              if (pGVar24->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00362ac5:
                pRVar109 = context->args;
                if (((RTCIntersectArguments *)pRVar109->filter != (RTCIntersectArguments *)0x0) &&
                   ((((ulong)*(Scene **)&pRVar109->flags & 2) != 0 ||
                    (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
                  (*(code *)pRVar109->filter)(&args);
                  uVar110 = extraout_RDX_02;
                  ray = local_210;
                  aVar333 = local_3f8;
                  aVar346 = local_3e8;
                  fVar320 = (float)local_408._0_4_;
                  fVar188 = (float)local_408._4_4_;
                  fVar223 = fStack_400;
                  fVar414 = fStack_3fc;
                  if (*args.valid == 0) goto LAB_00362b7e;
                }
                *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                uVar110 = (ulong)*(uint *)(args.hit + 0x1c);
                *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                pRVar109 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x20);
                *(uint *)(args.ray + 0x50) = *(uint *)(args.hit + 0x20);
                pRVar107 = args.ray;
              }
              else {
                (*pGVar24->intersectionFilterN)(&args);
                uVar110 = extraout_RDX_01;
                ray = local_210;
                aVar333 = local_3f8;
                aVar346 = local_3e8;
                fVar320 = (float)local_408._0_4_;
                fVar188 = (float)local_408._4_4_;
                fVar223 = fStack_400;
                fVar414 = fStack_3fc;
                if (*args.valid != 0) goto LAB_00362ac5;
LAB_00362b7e:
                (local_210->super_RayK<1>).tfar = (float)local_478._0_4_;
                pRVar107 = (RTCRayN *)args.valid;
                ray = local_210;
                aVar333 = local_3f8;
                aVar346 = local_3e8;
              }
              valid.field_0.v[lVar113] = 0.0;
              fVar361 = (ray->super_RayK<1>).tfar;
              local_478._0_4_ = (ray->super_RayK<1>).tfar;
              unique0x10004edb = (float)(ray->super_RayK<1>).mask;
              fStack_470 = (float)(ray->super_RayK<1>).id;
              unique0x10004ee3 = (ray->super_RayK<1>).flags;
              aVar176._0_4_ = -(uint)(aVar333.v[0] <= fVar361) & valid.field_0.i[0];
              aVar176._4_4_ = -(uint)(aVar333.v[1] <= fVar361) & valid.field_0.i[1];
              aVar176.i[2] = -(uint)(aVar333.v[2] <= fVar361) & valid.field_0.i[2];
              aVar176.i[3] = -(uint)(aVar333.v[3] <= fVar361) & valid.field_0.i[3];
              valid.field_0 = aVar176;
              iVar178 = movmskps((int)pRVar107,(undefined1  [16])aVar176);
              if (iVar178 != 0) {
                auVar218._0_4_ = aVar176._0_4_ & (uint)aVar333.v[0];
                auVar218._4_4_ = aVar176._4_4_ & (uint)aVar333.v[1];
                auVar218._8_4_ = aVar176.i[2] & (uint)aVar333.v[2];
                auVar218._12_4_ = aVar176.i[3] & (uint)aVar333.v[3];
                auVar254._0_8_ = CONCAT44(~aVar176._4_4_,~aVar176._0_4_) & 0x7f8000007f800000;
                auVar254._8_4_ = ~aVar176.i[2] & 0x7f800000;
                auVar254._12_4_ = ~aVar176.i[3] & 0x7f800000;
                auVar254 = auVar254 | auVar218;
                auVar274._4_4_ = auVar254._0_4_;
                auVar274._0_4_ = auVar254._4_4_;
                auVar274._8_4_ = auVar254._12_4_;
                auVar274._12_4_ = auVar254._8_4_;
                auVar190 = minps(auVar274,auVar254);
                auVar219._0_8_ = auVar190._8_8_;
                auVar219._8_4_ = auVar190._0_4_;
                auVar219._12_4_ = auVar190._4_4_;
                auVar190 = minps(auVar219,auVar190);
                auVar220._0_8_ =
                     CONCAT44(-(uint)(auVar190._4_4_ == auVar254._4_4_) & aVar176._4_4_,
                              -(uint)(auVar190._0_4_ == auVar254._0_4_) & aVar176._0_4_);
                auVar220._8_4_ = -(uint)(auVar190._8_4_ == auVar254._8_4_) & aVar176.i[2];
                auVar220._12_4_ = -(uint)(auVar190._12_4_ == auVar254._12_4_) & aVar176.i[3];
                iVar178 = movmskps(iVar178,auVar220);
                if (iVar178 != 0) {
                  aVar176.i[2] = auVar220._8_4_;
                  aVar176._0_8_ = auVar220._0_8_;
                  aVar176.i[3] = auVar220._12_4_;
                }
                uVar105 = movmskps(iVar178,(undefined1  [16])aVar176);
                uVar108 = CONCAT44((int)((ulong)pRVar107 >> 0x20),uVar105);
                lVar113 = 0;
                if (uVar108 != 0) {
                  for (; (uVar108 >> lVar113 & 1) == 0; lVar113 = lVar113 + 1) {
                  }
                }
                goto LAB_00362929;
              }
            }
            goto LAB_003618a8;
          }
        }
      }
    }
    uVar105 = SUB84(pRVar109,0);
    if (4 < iVar257) {
      local_208 = 1.0 / local_208;
      fStack_204 = local_208;
      fStack_200 = local_208;
      fStack_1fc = local_208;
      lVar113 = 4;
      iVar178 = iVar257;
      while( true ) {
        uVar105 = SUB84(pRVar109,0);
        if (lVar115 <= lVar113) break;
        uVar118 = (uint)lVar113;
        bVar26 = (int)(uVar118 | 1) < iVar257;
        bVar27 = (int)(uVar118 | 2) < iVar257;
        fStack_3d0 = (float)-(uint)bVar27;
        bVar28 = (int)(uVar118 | 3) < iVar257;
        fStack_3cc = (float)-(uint)bVar28;
        local_3d8 = CONCAT44(-(uint)bVar26,-(uint)((int)uVar118 < iVar257));
        pRVar109 = (RTCIntersectArguments *)(bezier_basis0 + lVar114);
        pauVar8 = (undefined1 (*) [16])((long)&pRVar109->flags + lVar113 * 4);
        fVar275 = *(float *)*pauVar8;
        fVar279 = *(float *)(*pauVar8 + 4);
        fVar316 = *(float *)(*pauVar8 + 8);
        auVar71 = *(undefined1 (*) [12])*pauVar8;
        fVar295 = *(float *)(*pauVar8 + 0xc);
        _local_388 = *pauVar8;
        pfVar1 = (float *)(lVar114 + 0x21fb768 + lVar113 * 4);
        fVar297 = *pfVar1;
        fVar350 = pfVar1[1];
        fVar317 = pfVar1[2];
        fVar324 = pfVar1[3];
        pfVar1 = (float *)(lVar114 + 0x21fbbec + lVar113 * 4);
        local_1b8 = *pfVar1;
        fStack_1b4 = pfVar1[1];
        fStack_1b0 = pfVar1[2];
        fStack_1ac = pfVar1[3];
        pfVar1 = (float *)(lVar114 + 0x21fc070 + lVar113 * 4);
        local_358 = *pfVar1;
        fStack_354 = pfVar1[1];
        fStack_350 = pfVar1[2];
        fStack_34c = pfVar1[3];
        fVar300 = fVar357 * fVar275 + fVar368 * fVar297 + fVar320 * local_1b8 + fVar221 * local_358;
        fVar310 = fVar357 * fVar279 +
                  fVar368 * fVar350 + fVar188 * fStack_1b4 + fVar361 * fStack_354;
        fVar280 = fVar357 * fVar316 +
                  fVar368 * fVar317 + fVar223 * fStack_1b0 + fStack_410 * fStack_350;
        fVar296 = fVar357 * fVar295 +
                  fVar368 * fVar324 + fVar414 * fStack_1ac + fStack_40c * fStack_34c;
        local_198 = local_188 * fVar275 +
                    fVar378 * fVar297 + local_428 * local_1b8 + local_438 * local_358;
        fStack_194 = fStack_184 * fVar279 +
                     fVar378 * fVar350 + fStack_424 * fStack_1b4 + fStack_434 * fStack_354;
        fStack_190 = fStack_180 * fVar316 +
                     fVar378 * fVar317 + fStack_420 * fStack_1b0 + fStack_430 * fStack_350;
        fStack_18c = fStack_17c * fVar295 +
                     fVar378 * fVar324 + fStack_41c * fStack_1ac + fStack_42c * fStack_34c;
        local_3c8._0_4_ =
             fVar391 * fVar275 + fVar413 * fVar297 + fVar401 * local_1b8 + fVar362 * local_358;
        local_3c8._4_4_ =
             fVar391 * fVar279 + fVar413 * fVar350 + fVar401 * fStack_1b4 + fVar362 * fStack_354;
        iStack_3c0 = (int)(fVar391 * fVar316 +
                          fVar413 * fVar317 + fVar401 * fStack_1b0 + fVar362 * fStack_350);
        iStack_3bc = (int)(fVar391 * fVar295 +
                          fVar413 * fVar324 + fVar401 * fStack_1ac + fVar362 * fStack_34c);
        pfVar1 = (float *)(bezier_basis1 + lVar114 + lVar113 * 4);
        fVar275 = *pfVar1;
        fVar279 = pfVar1[1];
        fVar316 = pfVar1[2];
        fVar334 = pfVar1[3];
        pfVar1 = (float *)(lVar114 + 0x21fdb88 + lVar113 * 4);
        fVar341 = *pfVar1;
        fVar390 = pfVar1[1];
        fVar336 = pfVar1[2];
        fVar337 = pfVar1[3];
        pfVar1 = (float *)(lVar114 + 0x21fe00c + lVar113 * 4);
        fVar338 = *pfVar1;
        fVar342 = pfVar1[1];
        fVar343 = pfVar1[2];
        fVar369 = pfVar1[3];
        pauVar9 = (undefined1 (*) [12])(lVar114 + 0x21fe490 + lVar113 * 4);
        fVar379 = *(float *)*pauVar9;
        fVar405 = *(float *)(*pauVar9 + 4);
        fVar410 = *(float *)(*pauVar9 + 8);
        auVar74 = *pauVar9;
        fVar382 = *(float *)pauVar9[1];
        fVar320 = fVar357 * fVar275 + fVar368 * fVar341 + fVar320 * fVar338 + fVar221 * fVar379;
        fVar298 = fVar357 * fVar279 + fVar368 * fVar390 + fVar188 * fVar342 + fVar361 * fVar405;
        fVar299 = fVar357 * fVar316 + fVar368 * fVar336 + fVar223 * fVar343 + fStack_410 * fVar410;
        fVar414 = fVar357 * fVar334 + fVar368 * fVar337 + fVar414 * fVar369 + fStack_40c * fVar382;
        fVar313 = local_188 * fVar275 +
                  fVar378 * fVar341 + local_428 * fVar338 + local_438 * fVar379;
        fVar318 = fStack_184 * fVar279 +
                  fVar378 * fVar390 + fStack_424 * fVar342 + fStack_434 * fVar405;
        fVar319 = fStack_180 * fVar316 +
                  fVar378 * fVar336 + fStack_420 * fVar343 + fStack_430 * fVar410;
        fVar321 = fStack_17c * fVar334 +
                  fVar378 * fVar337 + fStack_41c * fVar369 + fStack_42c * fVar382;
        auVar376._0_4_ =
             fVar391 * fVar275 + fVar413 * fVar341 + fVar401 * fVar338 + fVar362 * fVar379;
        auVar376._4_4_ =
             fVar391 * fVar279 + fVar413 * fVar390 + fVar401 * fVar342 + fVar362 * fVar405;
        auVar376._8_4_ =
             fVar391 * fVar316 + fVar413 * fVar336 + fVar401 * fVar343 + fVar362 * fVar410;
        auVar376._12_4_ =
             fVar391 * fVar334 + fVar413 * fVar337 + fVar401 * fVar369 + fVar362 * fVar382;
        fVar379 = fVar320 - fVar300;
        fVar405 = fVar298 - fVar310;
        fVar410 = fVar299 - fVar280;
        fVar312 = fVar414 - fVar296;
        fVar361 = fVar313 - local_198;
        fVar188 = fVar318 - fStack_194;
        fVar221 = fVar319 - fStack_190;
        fVar223 = fVar321 - fStack_18c;
        fVar322 = local_198 * fVar379 - fVar300 * fVar361;
        fVar344 = fStack_194 * fVar405 - fVar310 * fVar188;
        fVar347 = fStack_190 * fVar410 - fVar280 * fVar221;
        fVar348 = fStack_18c * fVar312 - fVar296 * fVar223;
        auVar190 = maxps(_local_3c8,auVar376);
        bVar94 = fVar322 * fVar322 <=
                 auVar190._0_4_ * auVar190._0_4_ * (fVar379 * fVar379 + fVar361 * fVar361) &&
                 (int)uVar118 < iVar257;
        auVar395._0_4_ = -(uint)bVar94;
        bVar26 = fVar344 * fVar344 <=
                 auVar190._4_4_ * auVar190._4_4_ * (fVar405 * fVar405 + fVar188 * fVar188) && bVar26
        ;
        auVar395._4_4_ = -(uint)bVar26;
        bVar27 = fVar347 * fVar347 <=
                 auVar190._8_4_ * auVar190._8_4_ * (fVar410 * fVar410 + fVar221 * fVar221) && bVar27
        ;
        auVar395._8_4_ = -(uint)bVar27;
        bVar28 = fVar348 * fVar348 <=
                 auVar190._12_4_ * auVar190._12_4_ * (fVar312 * fVar312 + fVar223 * fVar223) &&
                 bVar28;
        auVar395._12_4_ = -(uint)bVar28;
        uVar117 = movmskps((int)uVar110,auVar395);
        uVar110 = (ulong)uVar117;
        if (uVar117 == 0) {
LAB_00362595:
          fVar221 = (float)local_418;
          fVar361 = local_418._4_4_;
          fVar320 = (float)local_408._0_4_;
          fVar188 = (float)local_408._4_4_;
          fVar223 = fStack_400;
          fVar414 = fStack_3fc;
        }
        else {
          _local_1f8 = auVar376;
          local_478._0_4_ = auVar74._0_4_;
          stack0xfffffffffffffb8c = auVar74._4_4_;
          fStack_470 = auVar74._8_4_;
          fVar189 = (float)local_478._0_4_ * fVar184 + fVar338 * local_1d8 +
                    fVar341 * (float)local_398 + fVar275 * fVar381;
          fVar222 = stack0xfffffffffffffb8c * fVar184 + fVar342 * fStack_1d4 +
                    fVar390 * local_398._4_4_ + fVar279 * fVar381;
          fVar224 = fStack_470 * fVar184 + fVar343 * fStack_1d0 + fVar336 * (float)uStack_390 +
                    fVar316 * fVar381;
          fVar225 = fVar382 * fVar184 + fVar369 * fStack_1cc + fVar337 * uStack_390._4_4_ +
                    fVar334 * fVar381;
          local_388._0_4_ = auVar71._0_4_;
          local_388._4_4_ = auVar71._4_4_;
          fStack_380 = auVar71._8_4_;
          fVar182 = (float)local_388._0_4_ * fVar381;
          fVar185 = (float)local_388._4_4_ * fVar381;
          fVar187 = fStack_380 * fVar381;
          _local_388 = auVar395;
          fVar182 = local_358 * fVar184 + local_1b8 * local_1d8 + fVar297 * (float)local_398 +
                    fVar182;
          fVar185 = fStack_354 * fVar184 + fStack_1b4 * fStack_1d4 + fVar350 * local_398._4_4_ +
                    fVar185;
          fVar187 = fStack_350 * fVar184 + fStack_1b0 * fStack_1d0 + fVar317 * (float)uStack_390 +
                    fVar187;
          fVar352 = fStack_34c * fVar184 + fStack_1ac * fStack_1cc + fVar324 * uStack_390._4_4_ +
                    fVar295 * fVar381;
          pfVar1 = (float *)(lVar114 + 0x21fc4f4 + lVar113 * 4);
          fVar275 = *pfVar1;
          fVar279 = pfVar1[1];
          fVar316 = pfVar1[2];
          fVar295 = pfVar1[3];
          pfVar1 = (float *)(lVar114 + 0x21fc978 + lVar113 * 4);
          fVar297 = *pfVar1;
          fVar350 = pfVar1[1];
          fVar317 = pfVar1[2];
          fVar324 = pfVar1[3];
          pfVar1 = (float *)(lVar114 + 0x21fcdfc + lVar113 * 4);
          fVar334 = *pfVar1;
          fVar341 = pfVar1[1];
          fVar390 = pfVar1[2];
          fVar336 = pfVar1[3];
          pfVar1 = (float *)(lVar114 + 0x21fd280 + lVar113 * 4);
          fVar337 = *pfVar1;
          fVar338 = pfVar1[1];
          fVar342 = pfVar1[2];
          fVar343 = pfVar1[3];
          fVar359 = fVar357 * fVar275 +
                    fVar368 * fVar297 +
                    (float)local_408._0_4_ * fVar334 + (float)local_418 * fVar337;
          fVar363 = fVar357 * fVar279 +
                    fVar368 * fVar350 + (float)local_408._4_4_ * fVar341 + local_418._4_4_ * fVar338
          ;
          fVar366 = fVar357 * fVar316 +
                    fVar368 * fVar317 + fStack_400 * fVar390 + fStack_410 * fVar342;
          fVar392 = fVar357 * fVar295 +
                    fVar368 * fVar324 + fStack_3fc * fVar336 + fStack_40c * fVar343;
          fVar262 = local_188 * fVar275 +
                    fVar378 * fVar297 + local_428 * fVar334 + local_438 * fVar337;
          fVar276 = fStack_184 * fVar279 +
                    fVar378 * fVar350 + fStack_424 * fVar341 + fStack_434 * fVar338;
          fVar277 = fStack_180 * fVar316 +
                    fVar378 * fVar317 + fStack_420 * fVar390 + fStack_430 * fVar342;
          fVar278 = fStack_17c * fVar295 +
                    fVar378 * fVar324 + fStack_41c * fVar336 + fStack_42c * fVar343;
          pfVar1 = (float *)(lVar114 + 0x21fe914 + lVar113 * 4);
          fVar369 = *pfVar1;
          fVar382 = pfVar1[1];
          fVar322 = pfVar1[2];
          fVar344 = pfVar1[3];
          pfVar1 = (float *)(lVar114 + 0x21ff21c + lVar113 * 4);
          fVar347 = *pfVar1;
          fVar348 = pfVar1[1];
          fVar349 = pfVar1[2];
          fVar353 = pfVar1[3];
          pfVar1 = (float *)(lVar114 + 0x21ff6a0 + lVar113 * 4);
          fVar360 = *pfVar1;
          fVar364 = pfVar1[1];
          fVar367 = pfVar1[2];
          fVar370 = pfVar1[3];
          pfVar1 = (float *)(lVar114 + 0x21fed98 + lVar113 * 4);
          fVar380 = *pfVar1;
          fVar383 = pfVar1[1];
          fVar384 = pfVar1[2];
          fVar125 = pfVar1[3];
          fVar398 = fVar357 * fVar369 +
                    fVar368 * fVar380 +
                    (float)local_408._0_4_ * fVar347 + (float)local_418 * fVar360;
          fVar400 = fVar357 * fVar382 +
                    fVar368 * fVar383 + (float)local_408._4_4_ * fVar348 + local_418._4_4_ * fVar364
          ;
          fVar402 = fVar357 * fVar322 +
                    fVar368 * fVar384 + fStack_400 * fVar349 + fStack_410 * fVar367;
          fVar404 = fVar357 * fVar344 +
                    fVar368 * fVar125 + fStack_3fc * fVar353 + fStack_40c * fVar370;
          fVar409 = local_188 * fVar369 +
                    fVar378 * fVar380 + local_428 * fVar347 + local_438 * fVar360;
          fVar412 = fStack_184 * fVar382 +
                    fVar378 * fVar383 + fStack_424 * fVar348 + fStack_434 * fVar364;
          fVar415 = fStack_180 * fVar322 +
                    fVar378 * fVar384 + fStack_420 * fVar349 + fStack_430 * fVar367;
          fVar416 = fStack_17c * fVar344 +
                    fVar378 * fVar125 + fStack_41c * fVar353 + fStack_42c * fVar370;
          auVar377._0_8_ = CONCAT44(fVar363,fVar359) & 0x7fffffff7fffffff;
          auVar377._8_4_ = ABS(fVar366);
          auVar377._12_4_ = ABS(fVar392);
          auVar306._0_8_ = CONCAT44(fVar276,fVar262) & 0x7fffffff7fffffff;
          auVar306._8_4_ = ABS(fVar277);
          auVar306._12_4_ = ABS(fVar278);
          auVar190 = maxps(auVar377,auVar306);
          auVar388._0_8_ =
               CONCAT44(fVar279 * fVar381 +
                        fVar350 * local_398._4_4_ + fVar341 * fStack_1d4 + fVar338 * fVar184,
                        fVar275 * fVar381 +
                        fVar297 * (float)local_398 + fVar334 * local_1d8 + fVar337 * fVar184) &
               0x7fffffff7fffffff;
          auVar388._8_4_ =
               ABS(fVar316 * fVar381 +
                   fVar317 * (float)uStack_390 + fVar390 * fStack_1d0 + fVar342 * fVar184);
          auVar388._12_4_ =
               ABS(fVar295 * fVar381 +
                   fVar324 * uStack_390._4_4_ + fVar336 * fStack_1cc + fVar343 * fVar184);
          auVar190 = maxps(auVar190,auVar388);
          uVar117 = -(uint)(local_468 <= auVar190._0_4_);
          uVar119 = -(uint)(local_468 <= auVar190._4_4_);
          uVar120 = -(uint)(local_468 <= auVar190._8_4_);
          uVar121 = -(uint)(local_468 <= auVar190._12_4_);
          auVar307._0_4_ = ~uVar117 & (uint)fVar379;
          auVar307._4_4_ = ~uVar119 & (uint)fVar405;
          auVar307._8_4_ = ~uVar120 & (uint)fVar410;
          auVar307._12_4_ = ~uVar121 & (uint)fVar312;
          auVar356._0_4_ = (uint)fVar359 & uVar117;
          auVar356._4_4_ = (uint)fVar363 & uVar119;
          auVar356._8_4_ = (uint)fVar366 & uVar120;
          auVar356._12_4_ = (uint)fVar392 & uVar121;
          auVar356 = auVar356 | auVar307;
          fVar350 = (float)(~uVar117 & (uint)fVar361 | (uint)fVar262 & uVar117);
          fVar324 = (float)(~uVar119 & (uint)fVar188 | (uint)fVar276 & uVar119);
          fVar336 = (float)(~uVar120 & (uint)fVar221 | (uint)fVar277 & uVar120);
          fVar337 = (float)(~uVar121 & (uint)fVar223 | (uint)fVar278 & uVar121);
          auVar389._0_8_ = CONCAT44(fVar400,fVar398) & 0x7fffffff7fffffff;
          auVar389._8_4_ = ABS(fVar402);
          auVar389._12_4_ = ABS(fVar404);
          auVar249._0_8_ = CONCAT44(fVar412,fVar409) & 0x7fffffff7fffffff;
          auVar249._8_4_ = ABS(fVar415);
          auVar249._12_4_ = ABS(fVar416);
          auVar190 = maxps(auVar389,auVar249);
          auVar173._0_8_ =
               CONCAT44(fVar382 * fVar381 +
                        fVar383 * local_398._4_4_ + fVar348 * fStack_1d4 + fVar364 * fVar184,
                        fVar369 * fVar381 +
                        fVar380 * (float)local_398 + fVar347 * local_1d8 + fVar360 * fVar184) &
               0x7fffffff7fffffff;
          auVar173._8_4_ =
               ABS(fVar322 * fVar381 +
                   fVar384 * (float)uStack_390 + fVar349 * fStack_1d0 + fVar367 * fVar184);
          auVar173._12_4_ =
               ABS(fVar344 * fVar381 +
                   fVar125 * uStack_390._4_4_ + fVar353 * fStack_1cc + fVar370 * fVar184);
          auVar190 = maxps(auVar190,auVar173);
          uVar117 = -(uint)(local_468 <= auVar190._0_4_);
          uVar119 = -(uint)(local_468 <= auVar190._4_4_);
          uVar120 = -(uint)(local_468 <= auVar190._8_4_);
          uVar121 = -(uint)(local_468 <= auVar190._12_4_);
          fVar348 = (float)((uint)fVar398 & uVar117 | ~uVar117 & (uint)fVar379);
          fVar349 = (float)((uint)fVar400 & uVar119 | ~uVar119 & (uint)fVar405);
          fVar353 = (float)((uint)fVar402 & uVar120 | ~uVar120 & (uint)fVar410);
          fVar360 = (float)((uint)fVar404 & uVar121 | ~uVar121 & (uint)fVar312);
          fVar342 = (float)(~uVar117 & (uint)fVar361 | (uint)fVar409 & uVar117);
          fVar343 = (float)(~uVar119 & (uint)fVar188 | (uint)fVar412 & uVar119);
          fVar379 = (float)(~uVar120 & (uint)fVar221 | (uint)fVar415 & uVar120);
          fVar410 = (float)(~uVar121 & (uint)fVar223 | (uint)fVar416 & uVar121);
          fVar295 = auVar356._0_4_;
          fVar361 = auVar356._4_4_;
          fVar188 = auVar356._8_4_;
          fVar221 = auVar356._12_4_;
          auVar290._0_4_ = fVar350 * fVar350 + fVar295 * fVar295;
          auVar290._4_4_ = fVar324 * fVar324 + fVar361 * fVar361;
          auVar290._8_4_ = fVar336 * fVar336 + fVar188 * fVar188;
          auVar290._12_4_ = fVar337 * fVar337 + fVar221 * fVar221;
          auVar190 = rsqrtps(auVar307,auVar290);
          fVar223 = auVar190._0_4_;
          fVar275 = auVar190._4_4_;
          fVar279 = auVar190._8_4_;
          fVar316 = auVar190._12_4_;
          auVar308._0_4_ = fVar223 * fVar223 * auVar290._0_4_ * 0.5 * fVar223;
          auVar308._4_4_ = fVar275 * fVar275 * auVar290._4_4_ * 0.5 * fVar275;
          auVar308._8_4_ = fVar279 * fVar279 * auVar290._8_4_ * 0.5 * fVar279;
          auVar308._12_4_ = fVar316 * fVar316 * auVar290._12_4_ * 0.5 * fVar316;
          fVar334 = fVar223 * 1.5 - auVar308._0_4_;
          fVar341 = fVar275 * 1.5 - auVar308._4_4_;
          fVar390 = fVar279 * 1.5 - auVar308._8_4_;
          fVar338 = fVar316 * 1.5 - auVar308._12_4_;
          auVar291._0_4_ = fVar342 * fVar342 + fVar348 * fVar348;
          auVar291._4_4_ = fVar343 * fVar343 + fVar349 * fVar349;
          auVar291._8_4_ = fVar379 * fVar379 + fVar353 * fVar353;
          auVar291._12_4_ = fVar410 * fVar410 + fVar360 * fVar360;
          auVar190 = rsqrtps(auVar308,auVar291);
          fVar223 = auVar190._0_4_;
          fVar275 = auVar190._4_4_;
          fVar279 = auVar190._8_4_;
          fVar316 = auVar190._12_4_;
          fVar297 = fVar223 * 1.5 - fVar223 * fVar223 * auVar291._0_4_ * 0.5 * fVar223;
          fVar275 = fVar275 * 1.5 - fVar275 * fVar275 * auVar291._4_4_ * 0.5 * fVar275;
          fVar317 = fVar279 * 1.5 - fVar279 * fVar279 * auVar291._8_4_ * 0.5 * fVar279;
          fVar316 = fVar316 * 1.5 - fVar316 * fVar316 * auVar291._12_4_ * 0.5 * fVar316;
          fVar382 = fVar350 * fVar334 * (float)local_3c8._0_4_;
          fVar367 = fVar324 * fVar341 * (float)local_3c8._4_4_;
          fVar380 = fVar336 * fVar390 * (float)iStack_3c0;
          fVar384 = fVar337 * fVar338 * (float)iStack_3bc;
          fVar279 = -fVar295 * fVar334 * (float)local_3c8._0_4_;
          fVar295 = -fVar361 * fVar341 * (float)local_3c8._4_4_;
          fVar350 = -fVar188 * fVar390 * (float)iStack_3c0;
          fVar324 = -fVar221 * fVar338 * (float)iStack_3bc;
          fVar336 = fVar334 * 0.0 * (float)local_3c8._0_4_;
          fVar337 = fVar341 * 0.0 * (float)local_3c8._4_4_;
          fVar369 = fVar390 * 0.0 * (float)iStack_3c0;
          fVar405 = fVar338 * 0.0 * (float)iStack_3bc;
          local_358 = fVar182 + fVar336;
          fStack_354 = fVar185 + fVar337;
          fStack_350 = fVar187 + fVar369;
          fStack_34c = fVar352 + fVar405;
          fVar262 = fVar342 * fVar297 * auVar376._0_4_;
          fVar276 = fVar343 * fVar275 * auVar376._4_4_;
          fVar277 = fVar379 * fVar317 * auVar376._8_4_;
          fVar278 = fVar410 * fVar316 * auVar376._12_4_;
          fVar312 = fVar320 + fVar262;
          fVar322 = fVar298 + fVar276;
          fVar344 = fVar299 + fVar277;
          fVar347 = fVar414 + fVar278;
          fVar361 = -fVar348 * fVar297 * auVar376._0_4_;
          fVar188 = -fVar349 * fVar275 * auVar376._4_4_;
          fVar221 = -fVar353 * fVar317 * auVar376._8_4_;
          fVar223 = -fVar360 * fVar316 * auVar376._12_4_;
          fVar348 = fVar313 + fVar361;
          fVar349 = fVar318 + fVar188;
          fVar353 = fVar319 + fVar221;
          fVar360 = fVar321 + fVar223;
          fVar334 = fVar297 * 0.0 * auVar376._0_4_;
          fVar341 = fVar275 * 0.0 * auVar376._4_4_;
          fVar390 = fVar317 * 0.0 * auVar376._8_4_;
          fVar342 = fVar316 * 0.0 * auVar376._12_4_;
          fVar275 = fVar300 - fVar382;
          fVar316 = fVar310 - fVar367;
          fVar297 = fVar280 - fVar380;
          fVar317 = fVar296 - fVar384;
          fVar364 = fVar189 + fVar334;
          fVar370 = fVar222 + fVar341;
          fVar383 = fVar224 + fVar390;
          fVar125 = fVar225 + fVar342;
          fVar338 = local_198 - fVar279;
          fVar343 = fStack_194 - fVar295;
          fVar379 = fStack_190 - fVar350;
          fVar410 = fStack_18c - fVar324;
          fVar182 = fVar182 - fVar336;
          fVar185 = fVar185 - fVar337;
          fVar187 = fVar187 - fVar369;
          fVar352 = fVar352 - fVar405;
          uVar117 = -(uint)(0.0 < (fVar338 * (fVar364 - fVar182) - fVar182 * (fVar348 - fVar338)) *
                                  0.0 + (fVar182 * (fVar312 - fVar275) -
                                        (fVar364 - fVar182) * fVar275) * 0.0 +
                                        ((fVar348 - fVar338) * fVar275 -
                                        (fVar312 - fVar275) * fVar338));
          uVar119 = -(uint)(0.0 < (fVar343 * (fVar370 - fVar185) - fVar185 * (fVar349 - fVar343)) *
                                  0.0 + (fVar185 * (fVar322 - fVar316) -
                                        (fVar370 - fVar185) * fVar316) * 0.0 +
                                        ((fVar349 - fVar343) * fVar316 -
                                        (fVar322 - fVar316) * fVar343));
          uVar120 = -(uint)(0.0 < (fVar379 * (fVar383 - fVar187) - fVar187 * (fVar353 - fVar379)) *
                                  0.0 + (fVar187 * (fVar344 - fVar297) -
                                        (fVar383 - fVar187) * fVar297) * 0.0 +
                                        ((fVar353 - fVar379) * fVar297 -
                                        (fVar344 - fVar297) * fVar379));
          uVar121 = -(uint)(0.0 < (fVar410 * (fVar125 - fVar352) - fVar352 * (fVar360 - fVar410)) *
                                  0.0 + (fVar352 * (fVar347 - fVar317) -
                                        (fVar125 - fVar352) * fVar317) * 0.0 +
                                        ((fVar360 - fVar410) * fVar317 -
                                        (fVar347 - fVar317) * fVar410));
          local_368._0_4_ =
               (uint)(fVar320 - fVar262) & uVar117 | ~uVar117 & (uint)(fVar300 + fVar382);
          local_368._4_4_ =
               (uint)(fVar298 - fVar276) & uVar119 | ~uVar119 & (uint)(fVar310 + fVar367);
          fStack_360 = (float)((uint)(fVar299 - fVar277) & uVar120 |
                              ~uVar120 & (uint)(fVar280 + fVar380));
          fStack_35c = (float)((uint)(fVar414 - fVar278) & uVar121 |
                              ~uVar121 & (uint)(fVar296 + fVar384));
          fVar336 = (float)((uint)(fVar313 - fVar361) & uVar117 |
                           ~uVar117 & (uint)(local_198 + fVar279));
          fVar337 = (float)((uint)(fVar318 - fVar188) & uVar119 |
                           ~uVar119 & (uint)(fStack_194 + fVar295));
          fStack_3d0 = (float)((uint)(fVar319 - fVar221) & uVar120 |
                              ~uVar120 & (uint)(fStack_190 + fVar350));
          fStack_3cc = (float)((uint)(fVar321 - fVar223) & uVar121 |
                              ~uVar121 & (uint)(fStack_18c + fVar324));
          fVar414 = (float)((uint)(fVar189 - fVar334) & uVar117 | ~uVar117 & (uint)local_358);
          fVar300 = (float)((uint)(fVar222 - fVar341) & uVar119 | ~uVar119 & (uint)fStack_354);
          fVar310 = (float)((uint)(fVar224 - fVar390) & uVar120 | ~uVar120 & (uint)fStack_350);
          fVar280 = (float)((uint)(fVar225 - fVar342) & uVar121 | ~uVar121 & (uint)fStack_34c);
          fVar279 = (float)((uint)fVar275 & uVar117 | ~uVar117 & (uint)fVar312);
          fVar295 = (float)((uint)fVar316 & uVar119 | ~uVar119 & (uint)fVar322);
          fVar350 = (float)((uint)fVar297 & uVar120 | ~uVar120 & (uint)fVar344);
          fVar320 = (float)((uint)fVar317 & uVar121 | ~uVar121 & (uint)fVar347);
          fVar342 = (float)((uint)fVar338 & uVar117 | ~uVar117 & (uint)fVar348);
          fVar369 = (float)((uint)fVar343 & uVar119 | ~uVar119 & (uint)fVar349);
          fVar405 = (float)((uint)fVar379 & uVar120 | ~uVar120 & (uint)fVar353);
          fVar382 = (float)((uint)fVar410 & uVar121 | ~uVar121 & (uint)fVar360);
          fVar324 = (float)((uint)fVar182 & uVar117 | ~uVar117 & (uint)fVar364);
          fVar334 = (float)((uint)fVar185 & uVar119 | ~uVar119 & (uint)fVar370);
          fVar341 = (float)((uint)fVar187 & uVar120 | ~uVar120 & (uint)fVar383);
          fVar390 = (float)((uint)fVar352 & uVar121 | ~uVar121 & (uint)fVar125);
          fVar296 = (float)((uint)fVar312 & uVar117 | ~uVar117 & (uint)fVar275) -
                    (float)local_368._0_4_;
          fVar298 = (float)((uint)fVar322 & uVar119 | ~uVar119 & (uint)fVar316) -
                    (float)local_368._4_4_;
          fVar299 = (float)((uint)fVar344 & uVar120 | ~uVar120 & (uint)fVar297) - fStack_360;
          fVar312 = (float)((uint)fVar347 & uVar121 | ~uVar121 & (uint)fVar317) - fStack_35c;
          fVar338 = (float)((uint)fVar348 & uVar117 | ~uVar117 & (uint)fVar338) - fVar336;
          fVar343 = (float)((uint)fVar349 & uVar119 | ~uVar119 & (uint)fVar343) - fVar337;
          fVar379 = (float)((uint)fVar353 & uVar120 | ~uVar120 & (uint)fVar379) - fStack_3d0;
          fVar410 = (float)((uint)fVar360 & uVar121 | ~uVar121 & (uint)fVar410) - fStack_3cc;
          fVar313 = (float)((uint)fVar364 & uVar117 | ~uVar117 & (uint)fVar182) - fVar414;
          fVar318 = (float)((uint)fVar370 & uVar119 | ~uVar119 & (uint)fVar185) - fVar300;
          fVar319 = (float)((uint)fVar383 & uVar120 | ~uVar120 & (uint)fVar187) - fVar310;
          fVar321 = (float)((uint)fVar125 & uVar121 | ~uVar121 & (uint)fVar352) - fVar280;
          fVar349 = (float)local_368._0_4_ - fVar279;
          fVar353 = (float)local_368._4_4_ - fVar295;
          fVar360 = fStack_360 - fVar350;
          fVar364 = fStack_35c - fVar320;
          fVar361 = fVar336 - fVar342;
          fVar188 = fVar337 - fVar369;
          fVar221 = fStack_3d0 - fVar405;
          fVar223 = fStack_3cc - fVar382;
          local_3d8 = CONCAT44(fVar337,fVar336);
          fVar275 = fVar414 - fVar324;
          fVar316 = fVar300 - fVar334;
          fVar297 = fVar310 - fVar341;
          fVar317 = fVar280 - fVar390;
          fVar322 = (fVar336 * fVar313 - fVar414 * fVar338) * 0.0 +
                    (fVar414 * fVar296 - (float)local_368._0_4_ * fVar313) * 0.0 +
                    ((float)local_368._0_4_ * fVar338 - fVar336 * fVar296);
          fVar344 = (fVar337 * fVar318 - fVar300 * fVar343) * 0.0 +
                    (fVar300 * fVar298 - (float)local_368._4_4_ * fVar318) * 0.0 +
                    ((float)local_368._4_4_ * fVar343 - fVar337 * fVar298);
          auVar270._4_4_ = fVar344;
          auVar270._0_4_ = fVar322;
          fVar347 = (fStack_3d0 * fVar319 - fVar310 * fVar379) * 0.0 +
                    (fVar310 * fVar299 - fStack_360 * fVar319) * 0.0 +
                    (fStack_360 * fVar379 - fStack_3d0 * fVar299);
          fVar348 = (fStack_3cc * fVar321 - fVar280 * fVar410) * 0.0 +
                    (fVar280 * fVar312 - fStack_35c * fVar321) * 0.0 +
                    (fStack_35c * fVar410 - fStack_3cc * fVar312);
          auVar396._0_4_ =
               (fVar342 * fVar275 - fVar324 * fVar361) * 0.0 +
               (fVar324 * fVar349 - fVar279 * fVar275) * 0.0 +
               (fVar279 * fVar361 - fVar342 * fVar349);
          auVar396._4_4_ =
               (fVar369 * fVar316 - fVar334 * fVar188) * 0.0 +
               (fVar334 * fVar353 - fVar295 * fVar316) * 0.0 +
               (fVar295 * fVar188 - fVar369 * fVar353);
          auVar396._8_4_ =
               (fVar405 * fVar297 - fVar341 * fVar221) * 0.0 +
               (fVar341 * fVar360 - fVar350 * fVar297) * 0.0 +
               (fVar350 * fVar221 - fVar405 * fVar360);
          auVar396._12_4_ =
               (fVar382 * fVar317 - fVar390 * fVar223) * 0.0 +
               (fVar390 * fVar364 - fVar320 * fVar317) * 0.0 +
               (fVar320 * fVar223 - fVar382 * fVar364);
          auVar270._8_4_ = fVar347;
          auVar270._12_4_ = fVar348;
          auVar190 = maxps(auVar270,auVar396);
          bVar94 = auVar190._0_4_ <= 0.0 && bVar94;
          auVar271._0_4_ = -(uint)bVar94;
          bVar26 = auVar190._4_4_ <= 0.0 && bVar26;
          auVar271._4_4_ = -(uint)bVar26;
          bVar27 = auVar190._8_4_ <= 0.0 && bVar27;
          auVar271._8_4_ = -(uint)bVar27;
          bVar28 = auVar190._12_4_ <= 0.0 && bVar28;
          auVar271._12_4_ = -(uint)bVar28;
          iVar179 = movmskps((int)(bezier_basis1 + lVar114),auVar271);
          if (iVar179 == 0) {
            auVar251._8_8_ = uVar104;
            auVar251._0_8_ = uVar103;
            iVar179 = 0;
          }
          else {
            fVar279 = (ray->super_RayK<1>).tfar;
            fVar350 = fVar361 * fVar313 - fVar275 * fVar338;
            fVar320 = fVar188 * fVar318 - fVar316 * fVar343;
            fVar324 = fVar221 * fVar319 - fVar297 * fVar379;
            fVar334 = fVar223 * fVar321 - fVar317 * fVar410;
            fVar275 = fVar275 * fVar296 - fVar313 * fVar349;
            fVar316 = fVar316 * fVar298 - fVar318 * fVar353;
            fVar295 = fVar297 * fVar299 - fVar319 * fVar360;
            fVar297 = fVar317 * fVar312 - fVar321 * fVar364;
            fVar317 = fVar349 * fVar338 - fVar361 * fVar296;
            fVar341 = fVar353 * fVar343 - fVar188 * fVar298;
            fVar390 = fVar360 * fVar379 - fVar221 * fVar299;
            fVar338 = fVar364 * fVar410 - fVar223 * fVar312;
            auVar250._0_4_ = fVar275 * 0.0 + fVar317;
            auVar250._4_4_ = fVar316 * 0.0 + fVar341;
            auVar250._8_4_ = fVar295 * 0.0 + fVar390;
            auVar250._12_4_ = fVar297 * 0.0 + fVar338;
            auVar315._0_4_ = fVar350 * 0.0 + auVar250._0_4_;
            auVar315._4_4_ = fVar320 * 0.0 + auVar250._4_4_;
            auVar315._8_4_ = fVar324 * 0.0 + auVar250._8_4_;
            auVar315._12_4_ = fVar334 * 0.0 + auVar250._12_4_;
            auVar190 = rcpps(auVar250,auVar315);
            fVar361 = auVar190._0_4_;
            fVar188 = auVar190._4_4_;
            fVar221 = auVar190._8_4_;
            fVar223 = auVar190._12_4_;
            fVar361 = (1.0 - auVar315._0_4_ * fVar361) * fVar361 + fVar361;
            fVar188 = (1.0 - auVar315._4_4_ * fVar188) * fVar188 + fVar188;
            fVar221 = (1.0 - auVar315._8_4_ * fVar221) * fVar221 + fVar221;
            fVar223 = (1.0 - auVar315._12_4_ * fVar223) * fVar223 + fVar223;
            fVar275 = (fVar414 * fVar317 + fVar336 * fVar275 + (float)local_368._0_4_ * fVar350) *
                      fVar361;
            fVar316 = (fVar300 * fVar341 + fVar337 * fVar316 + (float)local_368._4_4_ * fVar320) *
                      fVar188;
            fVar295 = (fVar310 * fVar390 + fStack_3d0 * fVar295 + fStack_360 * fVar324) * fVar221;
            fVar297 = (fVar280 * fVar338 + fStack_3cc * fVar297 + fStack_35c * fVar334) * fVar223;
            bVar94 = (fVar275 <= fVar279 && local_1e8 <= fVar275) && bVar94;
            auVar292._0_4_ = -(uint)bVar94;
            bVar26 = (fVar316 <= fVar279 && fStack_1e4 <= fVar316) && bVar26;
            auVar292._4_4_ = -(uint)bVar26;
            bVar27 = (fVar295 <= fVar279 && fStack_1e0 <= fVar295) && bVar27;
            auVar292._8_4_ = -(uint)bVar27;
            bVar28 = (fVar297 <= fVar279 && fStack_1dc <= fVar297) && bVar28;
            auVar292._12_4_ = -(uint)bVar28;
            iVar179 = movmskps(iVar179,auVar292);
            if (iVar179 == 0) {
              auVar251._8_8_ = uVar104;
              auVar251._0_8_ = uVar103;
              iVar179 = 0;
            }
            else {
              auVar293._0_8_ =
                   CONCAT44(-(uint)(auVar315._4_4_ != 0.0 && bVar26),
                            -(uint)(auVar315._0_4_ != 0.0 && bVar94));
              auVar293._8_4_ = -(uint)(auVar315._8_4_ != 0.0 && bVar27);
              auVar293._12_4_ = -(uint)(auVar315._12_4_ != 0.0 && bVar28);
              iVar179 = movmskps(iVar179,auVar293);
              auVar251._8_8_ = uVar104;
              auVar251._0_8_ = uVar103;
              if (iVar179 != 0) {
                fVar322 = fVar322 * fVar361;
                fVar344 = fVar344 * fVar188;
                fVar347 = fVar347 * fVar221;
                fVar348 = fVar348 * fVar223;
                local_3a8 = (float)((uint)(1.0 - fVar322) & uVar117 | ~uVar117 & (uint)fVar322);
                fStack_3a4 = (float)((uint)(1.0 - fVar344) & uVar119 | ~uVar119 & (uint)fVar344);
                fStack_3a0 = (float)((uint)(1.0 - fVar347) & uVar120 | ~uVar120 & (uint)fVar347);
                fStack_39c = (float)((uint)(1.0 - fVar348) & uVar121 | ~uVar121 & (uint)fVar348);
                local_1c8 = (float)(~uVar117 & (uint)(auVar396._0_4_ * fVar361) |
                                   (uint)(1.0 - auVar396._0_4_ * fVar361) & uVar117);
                fStack_1c4 = (float)(~uVar119 & (uint)(auVar396._4_4_ * fVar188) |
                                    (uint)(1.0 - auVar396._4_4_ * fVar188) & uVar119);
                fStack_1c0 = (float)(~uVar120 & (uint)(auVar396._8_4_ * fVar221) |
                                    (uint)(1.0 - auVar396._8_4_ * fVar221) & uVar120);
                fStack_1bc = (float)(~uVar121 & (uint)(auVar396._12_4_ * fVar223) |
                                    (uint)(1.0 - auVar396._12_4_ * fVar223) & uVar121);
                auVar251._8_4_ = auVar293._8_4_;
                auVar251._0_8_ = auVar293._0_8_;
                auVar251._12_4_ = auVar293._12_4_;
                local_298 = fVar275;
                fStack_294 = fVar316;
                fStack_290 = fVar295;
                fStack_28c = fVar297;
              }
            }
          }
          iVar179 = movmskps(iVar179,auVar251);
          fVar221 = (float)local_418;
          fVar361 = local_418._4_4_;
          fVar320 = (float)local_408._0_4_;
          fVar188 = (float)local_408._4_4_;
          fVar223 = fStack_400;
          fVar414 = fStack_3fc;
          if (iVar179 != 0) {
            fVar279 = (auVar376._0_4_ - (float)local_3c8._0_4_) * local_3a8 + (float)local_3c8._0_4_
            ;
            fVar316 = (auVar376._4_4_ - (float)local_3c8._4_4_) * fStack_3a4 +
                      (float)local_3c8._4_4_;
            fVar295 = (auVar376._8_4_ - (float)iStack_3c0) * fStack_3a0 + (float)iStack_3c0;
            fVar297 = (auVar376._12_4_ - (float)iStack_3bc) * fStack_39c + (float)iStack_3bc;
            fVar275 = pre->depth_scale;
            aVar174._0_4_ = -(uint)(fVar275 * (fVar279 + fVar279) < local_298) & auVar251._0_4_;
            aVar174._4_4_ = -(uint)(fVar275 * (fVar316 + fVar316) < fStack_294) & auVar251._4_4_;
            aVar174.i[2] = -(uint)(fVar275 * (fVar295 + fVar295) < fStack_290) & auVar251._8_4_;
            aVar174.i[3] = -(uint)(fVar275 * (fVar297 + fVar297) < fStack_28c) & auVar251._12_4_;
            iVar179 = movmskps(uVar111,(undefined1  [16])aVar174);
            if (iVar179 != 0) {
              local_1c8 = local_1c8 + local_1c8 + -1.0;
              fStack_1c4 = fStack_1c4 + fStack_1c4 + -1.0;
              fStack_1c0 = fStack_1c0 + fStack_1c0 + -1.0;
              fStack_1bc = fStack_1bc + fStack_1bc + -1.0;
              bhit.U.field_0.v[1] = fStack_3a4;
              bhit.U.field_0.v[0] = local_3a8;
              bhit.U.field_0.v[2] = fStack_3a0;
              bhit.U.field_0.v[3] = fStack_39c;
              bhit.V.field_0.v[0] = local_1c8;
              bhit.V.field_0.v[1] = fStack_1c4;
              bhit.V.field_0.v[2] = fStack_1c0;
              bhit.V.field_0.v[3] = fStack_1bc;
              bhit.T.field_0.v[1] = fStack_294;
              bhit.T.field_0.v[0] = local_298;
              bhit.T.field_0.v[2] = fStack_290;
              bhit.T.field_0.v[3] = fStack_28c;
              bhit.i = uVar118;
              bhit.N = iVar178;
              bhit.curve3D.v0.field_0._0_8_ = CONCAT44(fVar260,fVar258);
              bhit.curve3D.v0.field_0._8_8_ = CONCAT44(fVar391,fVar261);
              bhit.curve3D.v1.field_0._0_8_ = CONCAT44(fVar408,fVar403);
              bhit.curve3D.v1.field_0._8_8_ = CONCAT44(fVar413,fVar411);
              bhit.curve3D.v2.field_0._0_8_ = CONCAT44(fVar397,fVar365);
              bhit.curve3D.v2.field_0._8_8_ = CONCAT44(fVar401,fVar399);
              bhit.curve3D.v3.field_0._0_8_ = CONCAT44(fVar351,fVar335);
              bhit.curve3D.v3.field_0._8_8_ = CONCAT44(fVar362,fVar358);
              bhit.valid.field_0 = aVar174;
              pGVar24 = (context->scene->geometries).items[(long)local_3b0].ptr;
              uVar117 = (ray->super_RayK<1>).mask;
              pRVar109 = local_3b0;
              if ((pGVar24->mask & uVar117) != 0) {
                valid.field_0 = aVar174;
                fVar361 = (float)(int)uVar118;
                bhit.vu.field_0.v[0] = (fVar361 + local_3a8 + 0.0) * local_208;
                bhit.vu.field_0.v[1] = (fVar361 + fStack_3a4 + 1.0) * fStack_204;
                bhit.vu.field_0.v[2] = (fVar361 + fStack_3a0 + 2.0) * fStack_200;
                bhit.vu.field_0.v[3] = (fVar361 + fStack_39c + 3.0) * fStack_1fc;
                bhit.vv.field_0._0_8_ = CONCAT44(fStack_1c4,local_1c8);
                bhit.vv.field_0._8_8_ = CONCAT44(fStack_1bc,fStack_1c0);
                bhit.vt.field_0.v[1] = fStack_294;
                bhit.vt.field_0.v[0] = local_298;
                bhit.vt.field_0.v[2] = fStack_290;
                bhit.vt.field_0.v[3] = fStack_28c;
                auVar212._0_4_ = aVar174._0_4_ & (uint)local_298;
                auVar212._4_4_ = aVar174._4_4_ & (uint)fStack_294;
                auVar212._8_4_ = aVar174.i[2] & (uint)fStack_290;
                auVar212._12_4_ = aVar174.i[3] & (uint)fStack_28c;
                auVar252._0_8_ = CONCAT44(~aVar174._4_4_,~aVar174._0_4_) & 0x7f8000007f800000;
                auVar252._8_4_ = ~aVar174.i[2] & 0x7f800000;
                auVar252._12_4_ = ~aVar174.i[3] & 0x7f800000;
                auVar252 = auVar252 | auVar212;
                auVar272._4_4_ = auVar252._0_4_;
                auVar272._0_4_ = auVar252._4_4_;
                auVar272._8_4_ = auVar252._12_4_;
                auVar272._12_4_ = auVar252._8_4_;
                auVar190 = minps(auVar272,auVar252);
                auVar213._0_8_ = auVar190._8_8_;
                auVar213._8_4_ = auVar190._0_4_;
                auVar213._12_4_ = auVar190._4_4_;
                auVar190 = minps(auVar213,auVar190);
                auVar214._0_8_ =
                     CONCAT44(-(uint)(auVar190._4_4_ == auVar252._4_4_) & aVar174._4_4_,
                              -(uint)(auVar190._0_4_ == auVar252._0_4_) & aVar174._0_4_);
                auVar214._8_4_ = -(uint)(auVar190._8_4_ == auVar252._8_4_) & aVar174.i[2];
                auVar214._12_4_ = -(uint)(auVar190._12_4_ == auVar252._12_4_) & aVar174.i[3];
                iVar179 = movmskps(uVar117,auVar214);
                if (iVar179 != 0) {
                  aVar174.i[2] = auVar214._8_4_;
                  aVar174._0_8_ = auVar214._0_8_;
                  aVar174.i[3] = auVar214._12_4_;
                }
                uVar117 = movmskps(iVar179,(undefined1  [16])aVar174);
                lVar116 = 0;
                if (uVar117 != 0) {
                  for (; (uVar117 >> lVar116 & 1) == 0; lVar116 = lVar116 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar24->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar361 = bhit.vu.field_0.v[lVar116];
                  fVar188 = bhit.vv.field_0.v[lVar116];
                  fVar221 = 1.0 - fVar361;
                  fVar275 = fVar361 * fVar221 + fVar361 * fVar221;
                  fVar223 = fVar221 * fVar221 * -3.0;
                  fVar279 = (fVar221 * fVar221 - fVar275) * 3.0;
                  fVar221 = (fVar275 - fVar361 * fVar361) * 3.0;
                  fVar275 = fVar361 * fVar361 * 3.0;
                  (ray->super_RayK<1>).tfar = bhit.vt.field_0.v[lVar116];
                  *(ulong *)&(ray->Ng).field_0 =
                       CONCAT44(fVar223 * fVar260 +
                                fVar279 * fVar408 + fVar221 * fVar397 + fVar275 * fVar351,
                                fVar223 * fVar258 +
                                fVar279 * fVar403 + fVar221 * fVar365 + fVar275 * fVar335);
                  (ray->Ng).field_0.field_0.z =
                       fVar223 * fVar261 + fVar279 * fVar411 + fVar221 * fVar399 + fVar275 * fVar358
                  ;
                  ray->u = fVar361;
                  ray->v = fVar188;
                  ray->primID = (uint)local_370;
                  ray->geomID = (uint)local_3b0;
                  ray->instID[0] = context->user->instID[0];
                  ray->instPrimID[0] = context->user->instPrimID[0];
                  pRVar109 = (RTCIntersectArguments *)context;
                }
                else {
                  local_3c8._0_4_ = iVar178;
                  local_3d8 = lVar115;
                  _local_478 = ZEXT416((uint)(ray->super_RayK<1>).tfar);
LAB_0036263f:
                  local_23c = bhit.vu.field_0.v[lVar116];
                  local_238 = bhit.vv.field_0.v[lVar116];
                  (ray->super_RayK<1>).tfar = bhit.vt.field_0.v[lVar116];
                  args.context = context->user;
                  fVar361 = 1.0 - local_23c;
                  fVar221 = local_23c * fVar361 + local_23c * fVar361;
                  fVar188 = fVar361 * fVar361 * -3.0;
                  fVar223 = (fVar361 * fVar361 - fVar221) * 3.0;
                  fVar361 = (fVar221 - local_23c * local_23c) * 3.0;
                  fVar221 = local_23c * local_23c * 3.0;
                  local_248 = CONCAT44(fVar188 * fVar260 +
                                       fVar223 * fVar408 + fVar361 * fVar397 + fVar221 * fVar351,
                                       fVar188 * fVar258 +
                                       fVar223 * fVar403 + fVar361 * fVar365 + fVar221 * fVar335);
                  local_240 = fVar188 * fVar261 +
                              fVar223 * fVar411 + fVar361 * fVar399 + fVar221 * fVar358;
                  local_234 = (int)local_370;
                  local_230 = (int)local_3b0;
                  local_22c = (args.context)->instID[0];
                  local_228 = (args.context)->instPrimID[0];
                  local_43c = -1;
                  args.valid = &local_43c;
                  pRVar109 = (RTCIntersectArguments *)pGVar24->userPtr;
                  args.geometryUserPtr = pRVar109;
                  args.ray = (RTCRayN *)ray;
                  args.hit = (RTCHitN *)&local_248;
                  args.N = 1;
                  if ((pGVar24->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                     ((*pGVar24->intersectionFilterN)(&args), uVar110 = extraout_RDX,
                     *args.valid != 0)) {
                    pRVar109 = context->args;
                    if (((RTCIntersectArguments *)pRVar109->filter != (RTCIntersectArguments *)0x0)
                       && (((((ulong)*(Scene **)&pRVar109->flags & 2) != 0 ||
                            (((pGVar24->field_8).field_0x2 & 0x40) != 0)) &&
                           ((*(code *)pRVar109->filter)(&args), uVar110 = extraout_RDX_00,
                           *args.valid == 0)))) goto LAB_00362858;
                    *(undefined4 *)(args.ray + 0x30) = *(undefined4 *)args.hit;
                    *(undefined4 *)(args.ray + 0x34) = *(undefined4 *)(args.hit + 4);
                    *(undefined4 *)(args.ray + 0x38) = *(undefined4 *)(args.hit + 8);
                    *(undefined4 *)(args.ray + 0x3c) = *(undefined4 *)(args.hit + 0xc);
                    *(undefined4 *)(args.ray + 0x40) = *(undefined4 *)(args.hit + 0x10);
                    *(undefined4 *)(args.ray + 0x44) = *(undefined4 *)(args.hit + 0x14);
                    *(undefined4 *)(args.ray + 0x48) = *(undefined4 *)(args.hit + 0x18);
                    uVar110 = (ulong)*(uint *)(args.hit + 0x1c);
                    *(uint *)(args.ray + 0x4c) = *(uint *)(args.hit + 0x1c);
                    pRVar109 = (RTCIntersectArguments *)(ulong)*(uint *)(args.hit + 0x20);
                    *(uint *)(args.ray + 0x50) = *(uint *)(args.hit + 0x20);
                    pRVar107 = args.ray;
                  }
                  else {
LAB_00362858:
                    (ray->super_RayK<1>).tfar = (float)local_478._0_4_;
                    pRVar107 = (RTCRayN *)args.valid;
                  }
                  valid.field_0.v[lVar116] = 0.0;
                  fVar361 = (ray->super_RayK<1>).tfar;
                  local_478._0_4_ = (ray->super_RayK<1>).tfar;
                  unique0x10004eb7 = (float)(ray->super_RayK<1>).mask;
                  fStack_470 = (float)(ray->super_RayK<1>).id;
                  unique0x10004ebf = (ray->super_RayK<1>).flags;
                  aVar175._0_4_ = -(uint)(local_298 <= fVar361) & valid.field_0.i[0];
                  aVar175._4_4_ = -(uint)(fStack_294 <= fVar361) & valid.field_0.i[1];
                  aVar175.i[2] = -(uint)(fStack_290 <= fVar361) & valid.field_0.i[2];
                  aVar175.i[3] = -(uint)(fStack_28c <= fVar361) & valid.field_0.i[3];
                  valid.field_0 = aVar175;
                  iVar178 = movmskps((int)pRVar107,(undefined1  [16])aVar175);
                  if (iVar178 != 0) {
                    auVar215._0_4_ = aVar175._0_4_ & (uint)local_298;
                    auVar215._4_4_ = aVar175._4_4_ & (uint)fStack_294;
                    auVar215._8_4_ = aVar175.i[2] & (uint)fStack_290;
                    auVar215._12_4_ = aVar175.i[3] & (uint)fStack_28c;
                    auVar253._0_8_ = CONCAT44(~aVar175._4_4_,~aVar175._0_4_) & 0x7f8000007f800000;
                    auVar253._8_4_ = ~aVar175.i[2] & 0x7f800000;
                    auVar253._12_4_ = ~aVar175.i[3] & 0x7f800000;
                    auVar253 = auVar253 | auVar215;
                    auVar273._4_4_ = auVar253._0_4_;
                    auVar273._0_4_ = auVar253._4_4_;
                    auVar273._8_4_ = auVar253._12_4_;
                    auVar273._12_4_ = auVar253._8_4_;
                    auVar190 = minps(auVar273,auVar253);
                    auVar216._0_8_ = auVar190._8_8_;
                    auVar216._8_4_ = auVar190._0_4_;
                    auVar216._12_4_ = auVar190._4_4_;
                    auVar190 = minps(auVar216,auVar190);
                    auVar217._0_8_ =
                         CONCAT44(-(uint)(auVar190._4_4_ == auVar253._4_4_) & aVar175._4_4_,
                                  -(uint)(auVar190._0_4_ == auVar253._0_4_) & aVar175._0_4_);
                    auVar217._8_4_ = -(uint)(auVar190._8_4_ == auVar253._8_4_) & aVar175.i[2];
                    auVar217._12_4_ = -(uint)(auVar190._12_4_ == auVar253._12_4_) & aVar175.i[3];
                    iVar178 = movmskps(iVar178,auVar217);
                    if (iVar178 != 0) {
                      aVar175.i[2] = auVar217._8_4_;
                      aVar175._0_8_ = auVar217._0_8_;
                      aVar175.i[3] = auVar217._12_4_;
                    }
                    uVar105 = movmskps(iVar178,(undefined1  [16])aVar175);
                    uVar108 = CONCAT44((int)((ulong)pRVar107 >> 0x20),uVar105);
                    lVar116 = 0;
                    if (uVar108 != 0) {
                      for (; (uVar108 >> lVar116 & 1) == 0; lVar116 = lVar116 + 1) {
                      }
                    }
                    goto LAB_0036263f;
                  }
                  lVar115 = local_3d8;
                  iVar178 = local_3c8._0_4_;
                }
                goto LAB_00362595;
              }
            }
          }
        }
        lVar113 = lVar113 + 4;
      }
    }
    fVar361 = (ray->super_RayK<1>).tfar;
    auVar211._4_4_ = -(uint)(fVar124 <= fVar361);
    auVar211._0_4_ = -(uint)(fVar123 <= fVar361);
    auVar211._8_4_ = -(uint)(fVar181 <= fVar361);
    auVar211._12_4_ = -(uint)(fVar311 <= fVar361);
    uVar117 = movmskps(uVar105,auVar211);
    uVar112 = (ulong)((uint)uVar112 & (uint)uVar112 + 0xf & uVar117);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }